

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

void compact_with_reopen_test(void)

{
  fdb_encryption_key *pfVar1;
  short *psVar2;
  size_t *psVar3;
  fdb_status fVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  btree *pbVar8;
  size_t sVar9;
  fdb_kvs_handle *pfVar10;
  size_t sVar11;
  uint64_t extraout_RAX;
  uint64_t uVar12;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar13;
  __atomic_base<unsigned_long> doc;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_config *kvs_config_00;
  fdb_kvs_commit_marker_t *pfVar15;
  fdb_file_info *kvs_config_01;
  void *__s2;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  code *__s;
  list *ptr_handle;
  fdb_kvs_handle **ppfVar19;
  char cVar20;
  uint uVar21;
  fdb_kvs_handle *unaff_RBP;
  fdb_kvs_handle *pfVar22;
  char *pcVar23;
  fdb_file_info *info_00;
  fdb_file_handle *pfVar24;
  fdb_iterator *pfVar25;
  btree *pbVar26;
  fdb_kvs_handle *pfVar27;
  undefined1 handle [8];
  btree *unaff_R12;
  fdb_kvs_handle *pfVar28;
  size_t unaff_R13;
  __atomic_base<unsigned_long> _Var29;
  filemgr *ptr_fhandle;
  fdb_config *pfVar30;
  ulong uVar31;
  size_t sVar32;
  char *pcVar33;
  char *pcVar34;
  fdb_doc **ppfVar35;
  timeval tVar36;
  timeval tVar37;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_doc *rdoc;
  fdb_kvs_handle *second_dbh;
  fdb_file_handle *second_dbfile;
  fdb_kvs_config kvs_config;
  fdb_file_info info;
  timeval __test_begin;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  char temp [256];
  fdb_kvs_handle *pfStack_18640;
  undefined1 auStack_18638 [16];
  undefined1 auStack_18628 [8];
  undefined1 auStack_18620 [80];
  ulong uStack_185d0;
  timeval tStack_185b0;
  fdb_file_info afStack_185a0 [3];
  fdb_file_info afStack_184a0 [3];
  fdb_config fStack_183a0;
  filemgr *pfStack_182a8;
  fdb_kvs_handle *pfStack_182a0;
  fdb_kvs_handle *pfStack_18298;
  fdb_config *pfStack_18290;
  fdb_kvs_handle *pfStack_18288;
  fdb_kvs_handle *pfStack_18280;
  fdb_file_handle *pfStack_18270;
  fdb_kvs_handle *pfStack_18268;
  timeval atStack_18260 [2];
  timeval tStack_18240;
  timeval tStack_18230;
  undefined1 auStack_18220 [70];
  undefined1 uStack_181da;
  undefined8 uStack_181d0;
  filemgr *pfStack_18110;
  fdb_kvs_handle *pfStack_18108;
  fdb_kvs_handle *pfStack_18100;
  filemgr *pfStack_180f8;
  fdb_kvs_handle *pfStack_180f0;
  fdb_kvs_handle *pfStack_180e8;
  undefined1 auStack_180d8 [8];
  undefined1 auStack_180d0 [8];
  undefined1 auStack_180c8 [8];
  undefined1 auStack_180c0 [16];
  undefined1 auStack_180b0 [16];
  fdb_kvs_config fStack_180a0;
  atomic<unsigned_long> aStack_18088;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18080;
  __atomic_base<unsigned_long> _Stack_18078;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18070;
  undefined1 auStack_18068 [8];
  undefined1 auStack_18060 [16];
  undefined1 auStack_18050 [16];
  atomic<unsigned_long> aStack_18040;
  fdb_open_flags fStack_1802c;
  ushort uStack_18022;
  filemgr *pfStack_18018;
  atomic<unsigned_long> aStack_17fd8;
  undefined1 auStack_17f58 [16];
  timeval tStack_17f48;
  undefined1 auStack_17f38 [328];
  char acStack_17df0 [256];
  char acStack_17cf0 [256];
  fdb_kvs_handle afStack_17bf0 [153];
  fdb_kvs_handle *pfStack_4328;
  fdb_kvs_handle *pfStack_4320;
  list *plStack_4318;
  void *pvStack_4310;
  fdb_kvs_config fStack_4308;
  fdb_kvs_info fStack_42f0;
  timeval tStack_42c0;
  fdb_config fStack_42b0;
  char acStack_41b8 [256];
  fdb_kvs_handle afStack_40b8 [2];
  fdb_kvs_handle **ppfStack_3b90;
  fdb_kvs_handle *pfStack_3b88;
  fdb_kvs_handle *pfStack_3b80;
  fdb_kvs_config *pfStack_3b78;
  fdb_kvs_handle *pfStack_3b70;
  fdb_kvs_handle *pfStack_3b68;
  undefined1 auStack_3b50 [16];
  undefined1 auStack_3b40 [32];
  fdb_kvs_handle *pfStack_3b20;
  fdb_kvs_config fStack_3b18;
  fdb_kvs_info fStack_3b00;
  timeval tStack_3ad0;
  char acStack_3ac0 [256];
  undefined1 auStack_39c0 [752];
  char acStack_36d0 [256];
  fdb_kvs_handle fStack_35d0;
  fdb_doc **ppfStack_33c8;
  fdb_kvs_handle *pfStack_33c0;
  undefined1 auStack_33a8 [16];
  fdb_doc *pfStack_3398;
  fdb_kvs_handle *pfStack_3390;
  fdb_doc *apfStack_3388 [11];
  timeval tStack_3330;
  undefined1 auStack_3320 [536];
  char acStack_3108 [256];
  stat sStack_3008;
  fdb_config fStack_2f78;
  fdb_kvs_handle **ppfStack_2e80;
  fdb_kvs_handle *pfStack_2e78;
  fdb_kvs_handle *pfStack_2e70;
  fdb_kvs_handle *pfStack_2e68;
  btree *pbStack_2e60;
  fdb_kvs_handle *pfStack_2e58;
  fdb_kvs_handle *pfStack_2e48;
  fdb_kvs_handle *pfStack_2e40;
  fdb_file_handle *pfStack_2e38;
  fdb_kvs_handle *pfStack_2e30;
  undefined1 auStack_2e28 [32];
  undefined1 auStack_2e08 [40];
  fdb_file_info fStack_2de0;
  fdb_config fStack_2d98;
  btree abStack_2ca0 [4];
  char acStack_2ba0 [256];
  char acStack_2aa0 [264];
  code *pcStack_2998;
  fdb_kvs_handle *pfStack_2990;
  fdb_kvs_handle *pfStack_2988;
  char *pcStack_2980;
  char *pcStack_2978;
  fdb_kvs_handle *pfStack_2970;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2958;
  fdb_file_handle *pfStack_2950;
  fdb_kvs_handle *pfStack_2948;
  int iStack_293c;
  undefined1 auStack_2938 [64];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_28f8;
  fdb_kvs_config fStack_28d0;
  timeval tStack_28b8;
  char acStack_28a8 [256];
  fdb_doc *apfStack_27a8 [20];
  undefined1 auStack_2708 [520];
  undefined8 uStack_2500;
  undefined8 uStack_24f8;
  undefined4 uStack_24e4;
  undefined1 uStack_24d9;
  undefined1 uStack_24c8;
  undefined8 uStack_2450;
  size_t sStack_2410;
  size_t sStack_2408;
  fdb_doc **ppfStack_2400;
  char *pcStack_23f8;
  code *pcStack_23f0;
  code *pcStack_23e8;
  fdb_file_handle *pfStack_23d0;
  fdb_snapshot_info_t *pfStack_23c8;
  uint64_t uStack_23c0;
  uint uStack_23b4;
  fdb_kvs_handle *apfStack_23b0 [4];
  fdb_kvs_config fStack_2390;
  char acStack_2378 [8];
  timeval tStack_2370;
  char acStack_2360 [256];
  char acStack_2260 [256];
  char acStack_2160 [264];
  fdb_config fStack_2058;
  fdb_doc *apfStack_1f60 [301];
  fdb_kvs_handle **ppfStack_15f8;
  btree *pbStack_15f0;
  size_t sStack_15e8;
  fdb_kvs_handle *pfStack_15e0;
  btree *pbStack_15d8;
  fdb_kvs_handle *pfStack_15d0;
  fdb_kvs_handle *pfStack_15b8;
  fdb_iterator *pfStack_15b0;
  fdb_kvs_handle *pfStack_15a8;
  undefined1 auStack_15a0 [16];
  undefined1 auStack_1590 [40];
  btree bStack_1568;
  fdb_kvs_info fStack_1520;
  fdb_config fStack_14f0;
  char acStack_13f8 [256];
  fdb_kvs_handle fStack_12f8;
  fdb_kvs_handle **ppfStack_10f0;
  btree *pbStack_10e8;
  size_t sStack_10e0;
  fdb_kvs_config *pfStack_10d8;
  fdb_file_handle **ppfStack_10d0;
  fdb_kvs_handle *pfStack_10c8;
  fdb_kvs_handle *pfStack_10b8;
  fdb_file_handle *pfStack_10b0;
  fdb_kvs_config fStack_10a8;
  timeval tStack_1090;
  fdb_kvs_info fStack_1080;
  char acStack_1050 [264];
  fdb_config fStack_f48;
  char acStack_e50 [256];
  char acStack_d50 [256];
  fdb_doc *apfStack_c50 [101];
  fdb_kvs_handle **ppfStack_928;
  btree *pbStack_920;
  size_t sStack_918;
  fdb_kvs_handle *pfStack_910;
  btree *pbStack_908;
  fdb_kvs_handle *pfStack_900;
  undefined1 local_8e8 [16];
  fdb_kvs_handle *local_8d8;
  fdb_kvs_handle *local_8d0;
  btree_kv_ops *local_8c8;
  undefined1 local_8c0 [40];
  docio_handle *local_898;
  timeval local_860;
  fdb_config local_850;
  btree local_758 [4];
  btree abStack_658 [14];
  fdb_kvs_handle local_338;
  
  pfStack_900 = (fdb_kvs_handle *)0x10cde4;
  gettimeofday(&local_860,(__timezone_ptr_t)0x0);
  pfStack_900 = (fdb_kvs_handle *)0x10cde9;
  memleak_start();
  pfStack_900 = (fdb_kvs_handle *)0x10cdf5;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_900 = (fdb_kvs_handle *)0x10ce05;
  fdb_get_default_config();
  pfVar10 = (fdb_kvs_handle *)local_8c0;
  pfStack_900 = (fdb_kvs_handle *)0x10ce12;
  fdb_get_default_kvs_config();
  local_850.buffercache_size = 0x1000000;
  local_850.wal_threshold = 0x400;
  local_850.flags = 1;
  local_850.compaction_threshold = '\0';
  pbVar8 = (btree *)local_8e8;
  pfStack_900 = (fdb_kvs_handle *)0x10ce44;
  fdb_open((fdb_file_handle **)pbVar8,"./compact_test1",&local_850);
  ppfVar19 = (fdb_kvs_handle **)(local_8e8 + 8);
  pfStack_900 = (fdb_kvs_handle *)0x10ce57;
  fdb_kvs_open_default((fdb_file_handle *)local_8e8._0_8_,ppfVar19,(fdb_kvs_config *)pfVar10);
  pfStack_900 = (fdb_kvs_handle *)0x10ce6d;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_8e8._8_8_,logCallbackFunc,"compact_with_reopen_test");
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d61b;
  unaff_R12 = (btree *)0x0;
  uVar16 = 0;
  do {
    pfVar1 = &local_338.config.encryption_key;
    pfStack_900 = (fdb_kvs_handle *)0x10ce95;
    sprintf((char *)pfVar1,"key%d",uVar16 & 0xffffffff);
    pfStack_900 = (fdb_kvs_handle *)0x10cead;
    sprintf((char *)&local_338,"meta%d",uVar16 & 0xffffffff);
    pfStack_900 = (fdb_kvs_handle *)0x10cec5;
    sprintf((char *)local_758,"body%d",uVar16 & 0xffffffff);
    pbVar8 = (btree *)(&abStack_658[0].ksize + (long)unaff_R12);
    pfStack_900 = (fdb_kvs_handle *)0x10ced8;
    unaff_R13 = strlen((char *)pfVar1);
    unaff_RBP = &local_338;
    pfStack_900 = (fdb_kvs_handle *)0x10ceeb;
    sVar6 = strlen((char *)unaff_RBP);
    pfStack_900 = (fdb_kvs_handle *)0x10cefb;
    sVar7 = strlen((char *)local_758);
    pfStack_900 = (fdb_kvs_handle *)0x10cf20;
    fdb_doc_create((fdb_doc **)pbVar8,&local_338.config.encryption_key,unaff_R13,unaff_RBP,sVar6,
                   local_758,sVar7);
    pfStack_900 = (fdb_kvs_handle *)0x10cf32;
    fdb_set((fdb_kvs_handle *)local_8e8._8_8_,*(fdb_doc **)(&abStack_658[0].ksize + uVar16 * 8));
    uVar16 = uVar16 + 1;
    unaff_R12 = (btree *)((long)unaff_R12 + 8);
  } while (uVar16 != 100);
  pfStack_900 = (fdb_kvs_handle *)0x10cf72;
  fdb_doc_create((fdb_doc **)&local_8d8,*(void **)(abStack_658[0].root_bid + 0x20),
                 *(size_t *)abStack_658[0].root_bid,*(void **)(abStack_658[0].root_bid + 0x38),
                 *(size_t *)(abStack_658[0].root_bid + 8),(void *)0x0,0);
  *(undefined1 *)&local_8d8->file = 1;
  ppfVar19 = (fdb_kvs_handle **)(local_8e8 + 8);
  pfStack_900 = (fdb_kvs_handle *)0x10cf86;
  fdb_set((fdb_kvs_handle *)local_8e8._8_8_,(fdb_doc *)local_8d8);
  pfStack_900 = (fdb_kvs_handle *)0x10cf8e;
  fdb_doc_free((fdb_doc *)local_8d8);
  pfVar10 = (fdb_kvs_handle *)local_8e8;
  pfStack_900 = (fdb_kvs_handle *)0x10cfa0;
  fdb_commit((fdb_file_handle *)local_8e8._0_8_,'\x01');
  pfStack_900 = (fdb_kvs_handle *)0x10cfaf;
  fdb_compact((fdb_file_handle *)local_8e8._0_8_,"./compact_test2");
  pfStack_900 = (fdb_kvs_handle *)0x10cfb7;
  fdb_kvs_close((fdb_kvs_handle *)local_8e8._8_8_);
  pfStack_900 = (fdb_kvs_handle *)0x10cfbf;
  fdb_close((fdb_file_handle *)local_8e8._0_8_);
  pfStack_900 = (fdb_kvs_handle *)0x10cfcb;
  system("mv  compact_test2 compact_test1 > errorlog.txt");
  pfStack_900 = (fdb_kvs_handle *)0x10cfe2;
  fdb_open((fdb_file_handle **)pfVar10,"./compact_test1",&local_850);
  pfStack_900 = (fdb_kvs_handle *)0x10cff2;
  fdb_kvs_open_default((fdb_file_handle *)local_8e8._0_8_,ppfVar19,(fdb_kvs_config *)local_8c0);
  pfStack_900 = (fdb_kvs_handle *)0x10d008;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_8e8._8_8_,logCallbackFunc,"compact_with_reopen_test");
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d620;
  unaff_R13 = 0;
  do {
    pfStack_900 = (fdb_kvs_handle *)0x10d03f;
    fdb_doc_create((fdb_doc **)&local_8d8,
                   (void *)(*(size_t **)(&abStack_658[0].ksize + unaff_R13 * 8))[4],
                   **(size_t **)(&abStack_658[0].ksize + unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0)
    ;
    pfStack_900 = (fdb_kvs_handle *)0x10d04e;
    fVar4 = fdb_get((fdb_kvs_handle *)local_8e8._8_8_,(fdb_doc *)local_8d8);
    pfVar28 = local_8d8;
    if (unaff_R13 == 1) {
      if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010d616;
    }
    else {
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d606;
      pbVar8 = local_8d8->staletree;
      unaff_RBP = *(fdb_kvs_handle **)(&abStack_658[0].ksize + unaff_R13 * 8);
      unaff_R12 = unaff_RBP->staletree;
      pfStack_900 = (fdb_kvs_handle *)0x10d090;
      iVar5 = bcmp(pbVar8,unaff_R12,(size_t)(local_8d8->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_0010d60b;
      pbVar8 = (pfVar28->field_6).seqtree;
      unaff_R12 = (unaff_RBP->field_6).seqtree;
      pfStack_900 = (fdb_kvs_handle *)0x10d0af;
      iVar5 = bcmp(pbVar8,unaff_R12,(size_t)(pfVar28->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0010d5fb;
    }
    pfStack_900 = (fdb_kvs_handle *)0x10d0bf;
    fdb_doc_free((fdb_doc *)pfVar28);
    unaff_R13 = unaff_R13 + 1;
    pfVar10 = pfVar28;
  } while (unaff_R13 != 100);
  pfStack_900 = (fdb_kvs_handle *)0x10d0de;
  fdb_get_file_info((fdb_file_handle *)local_8e8._0_8_,(fdb_file_info *)(local_8c0 + 0x18));
  pfStack_900 = (fdb_kvs_handle *)0x10d0ed;
  iVar5 = strcmp("./compact_test1",(char *)local_8c0._24_8_);
  if (iVar5 != 0) {
    pfStack_900 = (fdb_kvs_handle *)0x10d0fb;
    compact_with_reopen_test();
  }
  pfVar10 = &local_338;
  unaff_R12 = local_758;
  unaff_R13 = 0;
  uVar16 = 0;
  do {
    pfStack_900 = (fdb_kvs_handle *)0x10d123;
    sprintf((char *)pfVar10,"newmeta%d",uVar16 & 0xffffffff);
    pfStack_900 = (fdb_kvs_handle *)0x10d13e;
    sprintf((char *)unaff_R12,"newbody%d_%s",uVar16 & 0xffffffff,&local_338.bub_ctx.handle);
    pfStack_900 = (fdb_kvs_handle *)0x10d151;
    pbVar8 = (btree *)strlen((char *)pfVar10);
    pfStack_900 = (fdb_kvs_handle *)0x10d15c;
    sVar6 = strlen((char *)unaff_R12);
    pfStack_900 = (fdb_kvs_handle *)0x10d170;
    fdb_doc_update((fdb_doc **)(&abStack_658[0].ksize + unaff_R13),pfVar10,(size_t)pbVar8,unaff_R12,
                   sVar6);
    pfStack_900 = (fdb_kvs_handle *)0x10d182;
    fdb_set((fdb_kvs_handle *)local_8e8._8_8_,*(fdb_doc **)(&abStack_658[0].ksize + uVar16 * 8));
    uVar16 = uVar16 + 1;
    unaff_R13 = unaff_R13 + 8;
  } while (uVar16 != 100);
  pfStack_900 = (fdb_kvs_handle *)0x10d1ab;
  fdb_open((fdb_file_handle **)&local_8c8,"./compact_test1",&local_850);
  ppfVar19 = &local_8d0;
  pfStack_900 = (fdb_kvs_handle *)0x10d1c0;
  fdb_kvs_open_default((fdb_file_handle *)local_8c8,ppfVar19,(fdb_kvs_config *)local_8c0);
  pfStack_900 = (fdb_kvs_handle *)0x10d1d6;
  fVar4 = fdb_set_log_callback(local_8d0,logCallbackFunc,"compact_with_reopen_test");
  unaff_RBP = (fdb_kvs_handle *)0x64;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d625;
  pfStack_900 = (fdb_kvs_handle *)0x10d1ea;
  fVar4 = fdb_compact((fdb_file_handle *)local_8e8._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d62a;
  pfStack_900 = (fdb_kvs_handle *)0x10d1fe;
  fVar4 = fdb_compact((fdb_file_handle *)local_8e8._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d62f;
  pfStack_900 = (fdb_kvs_handle *)0x10d212;
  fVar4 = fdb_compact((fdb_file_handle *)local_8e8._0_8_,(char *)0x0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d634;
  pfStack_900 = (fdb_kvs_handle *)0x10d224;
  fdb_kvs_close((fdb_kvs_handle *)local_8e8._8_8_);
  pfStack_900 = (fdb_kvs_handle *)0x10d22e;
  fdb_close((fdb_file_handle *)local_8e8._0_8_);
  unaff_R13 = 0;
  ppfVar19 = &local_8d8;
  pfVar14 = pfVar10;
  do {
    pfStack_900 = (fdb_kvs_handle *)0x10d25d;
    fdb_doc_create((fdb_doc **)ppfVar19,
                   (void *)(*(size_t **)(&abStack_658[0].ksize + unaff_R13 * 8))[4],
                   **(size_t **)(&abStack_658[0].ksize + unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0)
    ;
    pfStack_900 = (fdb_kvs_handle *)0x10d26c;
    fVar4 = fdb_get(local_8d0,(fdb_doc *)local_8d8);
    pfVar10 = local_8d8;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pfStack_900 = (fdb_kvs_handle *)0x10d5ca;
      compact_with_reopen_test();
LAB_0010d5ca:
      pfStack_900 = (fdb_kvs_handle *)0x10d5d5;
      compact_with_reopen_test();
LAB_0010d5d5:
      pfStack_900 = (fdb_kvs_handle *)0x10d5e0;
      compact_with_reopen_test();
      goto LAB_0010d5e0;
    }
    pbVar8 = local_8d8->staletree;
    unaff_RBP = *(fdb_kvs_handle **)(&abStack_658[0].ksize + unaff_R13 * 8);
    unaff_R12 = unaff_RBP->staletree;
    pfStack_900 = (fdb_kvs_handle *)0x10d298;
    iVar5 = bcmp(pbVar8,unaff_R12,(size_t)(local_8d8->kvs_config).custom_cmp);
    pfVar14 = pfVar10;
    if (iVar5 != 0) goto LAB_0010d5ca;
    pbVar8 = (pfVar10->field_6).seqtree;
    unaff_R12 = (unaff_RBP->field_6).seqtree;
    pfStack_900 = (fdb_kvs_handle *)0x10d2b7;
    iVar5 = bcmp(pbVar8,unaff_R12,(size_t)(pfVar10->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0010d5d5;
    pfStack_900 = (fdb_kvs_handle *)0x10d2c7;
    fdb_doc_free((fdb_doc *)pfVar10);
    unaff_R13 = unaff_R13 + 1;
  } while (unaff_R13 != 100);
  pfStack_900 = (fdb_kvs_handle *)0x10d2ed;
  fVar4 = fdb_open((fdb_file_handle **)local_8e8,"./compact_test1",&local_850);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d639;
  pfStack_900 = (fdb_kvs_handle *)0x10d309;
  fVar4 = fdb_kvs_open_default
                    ((fdb_file_handle *)local_8e8._0_8_,(fdb_kvs_handle **)(local_8e8 + 8),
                     (fdb_kvs_config *)local_8c0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d63e;
  pfStack_900 = (fdb_kvs_handle *)0x10d329;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_8e8._8_8_,logCallbackFunc,"compact_with_reopen_test");
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d643;
  pfStack_900 = (fdb_kvs_handle *)0x10d343;
  fdb_get_file_info((fdb_file_handle *)local_8e8._0_8_,(fdb_file_info *)(local_8c0 + 0x18));
  pfStack_900 = (fdb_kvs_handle *)0x10d352;
  iVar5 = strcmp("./compact_test1.3",(char *)local_8c0._24_8_);
  if (iVar5 != 0) {
    pfStack_900 = (fdb_kvs_handle *)0x10d360;
    compact_with_reopen_test();
  }
  pfStack_900 = (fdb_kvs_handle *)0x10d36a;
  fdb_kvs_close(local_8d0);
  pfStack_900 = (fdb_kvs_handle *)0x10d374;
  fdb_close((fdb_file_handle *)local_8c8);
  unaff_R13 = 0;
  do {
    pfStack_900 = (fdb_kvs_handle *)0x10d3a3;
    fdb_doc_create((fdb_doc **)&local_8d8,
                   (void *)(*(size_t **)(&abStack_658[0].ksize + unaff_R13 * 8))[4],
                   **(size_t **)(&abStack_658[0].ksize + unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0)
    ;
    pfStack_900 = (fdb_kvs_handle *)0x10d3b2;
    fVar4 = fdb_get((fdb_kvs_handle *)local_8e8._8_8_,(fdb_doc *)local_8d8);
    pfVar28 = local_8d8;
    pfVar14 = pfVar10;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d5e0;
    pbVar8 = local_8d8->staletree;
    unaff_RBP = *(fdb_kvs_handle **)(&abStack_658[0].ksize + unaff_R13 * 8);
    unaff_R12 = unaff_RBP->staletree;
    pfStack_900 = (fdb_kvs_handle *)0x10d3de;
    iVar5 = bcmp(pbVar8,unaff_R12,(size_t)(local_8d8->kvs_config).custom_cmp);
    if (iVar5 != 0) goto LAB_0010d5e5;
    pbVar8 = (pfVar28->field_6).seqtree;
    unaff_R12 = (unaff_RBP->field_6).seqtree;
    pfStack_900 = (fdb_kvs_handle *)0x10d3fd;
    iVar5 = bcmp(pbVar8,unaff_R12,(size_t)(pfVar28->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_0010d5f0;
    pfStack_900 = (fdb_kvs_handle *)0x10d40d;
    fdb_doc_free((fdb_doc *)pfVar28);
    unaff_R13 = unaff_R13 + 1;
    pfVar10 = pfVar28;
  } while (unaff_R13 != 100);
  ppfVar19 = (fdb_kvs_handle **)local_8e8;
  pfStack_900 = (fdb_kvs_handle *)0x10d429;
  fdb_compact((fdb_file_handle *)local_8e8._0_8_,(char *)0x0);
  pfVar10 = (fdb_kvs_handle *)(local_8e8 + 8);
  pfStack_900 = (fdb_kvs_handle *)0x10d436;
  fdb_kvs_close((fdb_kvs_handle *)local_8e8._8_8_);
  pfStack_900 = (fdb_kvs_handle *)0x10d43e;
  fdb_close((fdb_file_handle *)local_8e8._0_8_);
  pfStack_900 = (fdb_kvs_handle *)0x10d44a;
  system("mv  compact_test1 compact_test.fdb > errorlog.txt");
  pfStack_900 = (fdb_kvs_handle *)0x10d461;
  fdb_open((fdb_file_handle **)ppfVar19,"./compact_test.fdb",&local_850);
  pfStack_900 = (fdb_kvs_handle *)0x10d471;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_8e8._0_8_,(fdb_kvs_handle **)pfVar10,
             (fdb_kvs_config *)local_8c0);
  pfStack_900 = (fdb_kvs_handle *)0x10d487;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_8e8._8_8_,logCallbackFunc,"compact_with_reopen_test");
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d648;
  ppfVar19 = (fdb_kvs_handle **)local_8e8;
  pfStack_900 = (fdb_kvs_handle *)0x10d49e;
  fdb_compact((fdb_file_handle *)local_8e8._0_8_,(char *)0x0);
  pfStack_900 = (fdb_kvs_handle *)0x10d4a8;
  fdb_kvs_close((fdb_kvs_handle *)local_8e8._8_8_);
  pfStack_900 = (fdb_kvs_handle *)0x10d4b0;
  fdb_close((fdb_file_handle *)local_8e8._0_8_);
  pfStack_900 = (fdb_kvs_handle *)0x10d4c7;
  fVar4 = fdb_open((fdb_file_handle **)ppfVar19,"./compact_test.fdb",&local_850);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d64d;
  pfStack_900 = (fdb_kvs_handle *)0x10d4e3;
  fVar4 = fdb_kvs_open_default
                    ((fdb_file_handle *)local_8e8._0_8_,(fdb_kvs_handle **)(local_8e8 + 8),
                     (fdb_kvs_config *)local_8c0);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010d652;
  pfStack_900 = (fdb_kvs_handle *)0x10d503;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_8e8._8_8_,logCallbackFunc,"compact_with_reopen_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_900 = (fdb_kvs_handle *)0x10d51d;
    fdb_get_file_info((fdb_file_handle *)local_8e8._0_8_,(fdb_file_info *)(local_8c0 + 0x18));
    pfStack_900 = (fdb_kvs_handle *)0x10d52c;
    iVar5 = strcmp("./compact_test.fdb",(char *)local_8c0._24_8_);
    if (iVar5 != 0) {
      pfStack_900 = (fdb_kvs_handle *)0x10d53a;
      compact_with_reopen_test();
    }
    if (local_898 != (docio_handle *)0x64) {
      pfStack_900 = (fdb_kvs_handle *)0x10d54c;
      compact_with_reopen_test();
    }
    lVar17 = 0;
    do {
      pfStack_900 = (fdb_kvs_handle *)0x10d55b;
      fdb_doc_free(*(fdb_doc **)(&abStack_658[0].ksize + lVar17 * 8));
      lVar17 = lVar17 + 1;
    } while (lVar17 != 100);
    pfStack_900 = (fdb_kvs_handle *)0x10d56e;
    fdb_kvs_close((fdb_kvs_handle *)local_8e8._8_8_);
    pfStack_900 = (fdb_kvs_handle *)0x10d578;
    fdb_close((fdb_file_handle *)local_8e8._0_8_);
    pfStack_900 = (fdb_kvs_handle *)0x10d57d;
    fdb_shutdown();
    pfStack_900 = (fdb_kvs_handle *)0x10d582;
    memleak_end();
    pcVar23 = "%s PASSED\n";
    if (compact_with_reopen_test()::__test_pass != '\0') {
      pcVar23 = "%s FAILED\n";
    }
    pfStack_900 = (fdb_kvs_handle *)0x10d5b3;
    fprintf(_stderr,pcVar23,"compaction with reopen test");
    return;
  }
  goto LAB_0010d657;
LAB_0010eb2a:
  pfStack_2970 = (fdb_kvs_handle *)0x10eb2f;
  compact_upto_test();
  pcVar34 = pcVar33;
  goto LAB_0010eb2f;
LAB_001108a3:
  pfStack_180e8 = (fdb_kvs_handle *)0x1108ae;
  compaction_daemon_test();
  doc._M_i = _Var29._M_i;
LAB_001108ae:
  _Var29._M_i = doc._M_i;
  pfStack_180e8 = (fdb_kvs_handle *)0x1108b3;
  compaction_daemon_test();
LAB_001108b3:
  pfStack_180e8 = (fdb_kvs_handle *)0x1108be;
  pcVar33 = pcVar23;
  compaction_daemon_test();
  doc._M_i = _Var29._M_i;
LAB_001108be:
  pfVar14 = (fdb_kvs_handle *)auStack_180c0;
  ptr_fhandle = (filemgr *)(auStack_17f38 + 0x48);
  pfStack_180e8 = (fdb_kvs_handle *)0x1108c3;
  compaction_daemon_test();
  goto LAB_001108c3;
LAB_00110f58:
  auto_compaction_with_custom_cmp_function();
LAB_00110f5d:
  auto_compaction_with_custom_cmp_function();
LAB_00110f62:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110f67;
LAB_0010d5e0:
  pfVar28 = pfVar14;
  pfStack_900 = (fdb_kvs_handle *)0x10d5e5;
  compact_with_reopen_test();
LAB_0010d5e5:
  pfStack_900 = (fdb_kvs_handle *)0x10d5f0;
  compact_with_reopen_test();
LAB_0010d5f0:
  pfStack_900 = (fdb_kvs_handle *)0x10d5fb;
  compact_with_reopen_test();
LAB_0010d5fb:
  pfStack_900 = (fdb_kvs_handle *)0x10d606;
  compact_with_reopen_test();
  pfVar10 = pfVar28;
LAB_0010d606:
  pfVar28 = pfVar10;
  pfStack_900 = (fdb_kvs_handle *)0x10d60b;
  compact_with_reopen_test();
LAB_0010d60b:
  pfStack_900 = (fdb_kvs_handle *)0x10d616;
  compact_with_reopen_test();
  pfVar10 = pfVar28;
LAB_0010d616:
  ppfVar19 = &local_8d8;
  pfStack_900 = (fdb_kvs_handle *)0x10d61b;
  compact_with_reopen_test();
LAB_0010d61b:
  pfStack_900 = (fdb_kvs_handle *)0x10d620;
  compact_with_reopen_test();
LAB_0010d620:
  pfStack_900 = (fdb_kvs_handle *)0x10d625;
  compact_with_reopen_test();
LAB_0010d625:
  pfStack_900 = (fdb_kvs_handle *)0x10d62a;
  compact_with_reopen_test();
LAB_0010d62a:
  pfStack_900 = (fdb_kvs_handle *)0x10d62f;
  compact_with_reopen_test();
LAB_0010d62f:
  pfStack_900 = (fdb_kvs_handle *)0x10d634;
  compact_with_reopen_test();
LAB_0010d634:
  pfStack_900 = (fdb_kvs_handle *)0x10d639;
  compact_with_reopen_test();
LAB_0010d639:
  pfStack_900 = (fdb_kvs_handle *)0x10d63e;
  compact_with_reopen_test();
LAB_0010d63e:
  pfStack_900 = (fdb_kvs_handle *)0x10d643;
  compact_with_reopen_test();
LAB_0010d643:
  pfStack_900 = (fdb_kvs_handle *)0x10d648;
  compact_with_reopen_test();
LAB_0010d648:
  pfStack_900 = (fdb_kvs_handle *)0x10d64d;
  compact_with_reopen_test();
LAB_0010d64d:
  pfStack_900 = (fdb_kvs_handle *)0x10d652;
  compact_with_reopen_test();
LAB_0010d652:
  pfStack_900 = (fdb_kvs_handle *)0x10d657;
  compact_with_reopen_test();
LAB_0010d657:
  pfStack_900 = (fdb_kvs_handle *)compact_reopen_named_kvs;
  compact_with_reopen_test();
  pfStack_10c8 = (fdb_kvs_handle *)0x10d679;
  ppfStack_928 = ppfVar19;
  pbStack_920 = unaff_R12;
  sStack_918 = unaff_R13;
  pfStack_910 = pfVar10;
  pbStack_908 = pbVar8;
  pfStack_900 = unaff_RBP;
  gettimeofday(&tStack_1090,(__timezone_ptr_t)0x0);
  pfStack_10c8 = (fdb_kvs_handle *)0x10d67e;
  memleak_start();
  pfStack_10c8 = (fdb_kvs_handle *)0x10d68a;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_10c8 = (fdb_kvs_handle *)0x10d69a;
  fdb_get_default_config();
  pfStack_10c8 = (fdb_kvs_handle *)0x10d6a7;
  fdb_get_default_kvs_config();
  fStack_f48.wal_threshold = 0x400;
  fStack_f48.flags = 1;
  fStack_f48.compaction_threshold = '\0';
  pfStack_10c8 = (fdb_kvs_handle *)0x10d6d1;
  fdb_open(&pfStack_10b0,"./compact_test1",&fStack_f48);
  pfStack_10c8 = (fdb_kvs_handle *)0x10d6eb;
  fdb_kvs_open(pfStack_10b0,&pfStack_10b8,"db",&fStack_10a8);
  pfStack_10c8 = (fdb_kvs_handle *)0x10d701;
  fVar4 = fdb_set_log_callback(pfStack_10b8,logCallbackFunc,"compact_reopen_named_kvs");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    lVar17 = 0;
    uVar16 = 0;
    do {
      pfStack_10c8 = (fdb_kvs_handle *)0x10d729;
      sprintf(acStack_d50,"key%d",uVar16 & 0xffffffff);
      pfStack_10c8 = (fdb_kvs_handle *)0x10d741;
      sprintf(acStack_e50,"meta%d",uVar16 & 0xffffffff);
      pfStack_10c8 = (fdb_kvs_handle *)0x10d756;
      sprintf(acStack_1050,"body%d",uVar16 & 0xffffffff);
      pfStack_10c8 = (fdb_kvs_handle *)0x10d769;
      sVar6 = strlen(acStack_d50);
      pfStack_10c8 = (fdb_kvs_handle *)0x10d77c;
      sVar7 = strlen(acStack_e50);
      pfStack_10c8 = (fdb_kvs_handle *)0x10d789;
      sVar9 = strlen(acStack_1050);
      pfStack_10c8 = (fdb_kvs_handle *)0x10d7ab;
      fdb_doc_create((fdb_doc **)((long)apfStack_c50 + lVar17),acStack_d50,sVar6,acStack_e50,sVar7,
                     acStack_1050,sVar9);
      pfStack_10c8 = (fdb_kvs_handle *)0x10d7bd;
      fdb_set(pfStack_10b8,apfStack_c50[uVar16]);
      uVar16 = uVar16 + 1;
      lVar17 = lVar17 + 8;
    } while (uVar16 != 100);
    pfStack_10c8 = (fdb_kvs_handle *)0x10d7dd;
    fdb_commit(pfStack_10b0,'\0');
    pfStack_10c8 = (fdb_kvs_handle *)0x10d7e7;
    fdb_compact(pfStack_10b0,(char *)0x0);
    pfStack_10c8 = (fdb_kvs_handle *)0x10d7fd;
    fdb_get_kvs_info(pfStack_10b8,&fStack_1080);
    lVar17 = (long)(int)fStack_1080.doc_count;
    pfStack_10c8 = (fdb_kvs_handle *)0x10d80a;
    fdb_kvs_close(pfStack_10b8);
    pfStack_10c8 = (fdb_kvs_handle *)0x10d812;
    fdb_close(pfStack_10b0);
    pfStack_10c8 = (fdb_kvs_handle *)0x10d829;
    fdb_open(&pfStack_10b0,"./compact_test1",&fStack_f48);
    pfStack_10c8 = (fdb_kvs_handle *)0x10d840;
    fdb_kvs_open(pfStack_10b0,&pfStack_10b8,"db",&fStack_10a8);
    pfStack_10c8 = (fdb_kvs_handle *)0x10d84c;
    fdb_get_kvs_info(pfStack_10b8,&fStack_1080);
    if (lVar17 != CONCAT44(fStack_1080.doc_count._4_4_,(int)fStack_1080.doc_count)) {
      pfStack_10c8 = (fdb_kvs_handle *)0x10d85f;
      compact_reopen_named_kvs();
    }
    pfStack_10c8 = (fdb_kvs_handle *)0x10d869;
    fdb_kvs_close(pfStack_10b8);
    pfStack_10c8 = (fdb_kvs_handle *)0x10d873;
    fdb_close(pfStack_10b0);
    lVar17 = 0;
    do {
      pfStack_10c8 = (fdb_kvs_handle *)0x10d882;
      fdb_doc_free(apfStack_c50[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 100);
    pfStack_10c8 = (fdb_kvs_handle *)0x10d890;
    fdb_shutdown();
    pfStack_10c8 = (fdb_kvs_handle *)0x10d895;
    memleak_end();
    pcVar23 = "%s PASSED\n";
    if (compact_reopen_named_kvs()::__test_pass != '\0') {
      pcVar23 = "%s FAILED\n";
    }
    pfStack_10c8 = (fdb_kvs_handle *)0x10d8c6;
    fprintf(_stderr,pcVar23,"compact reopen named kvs");
    return;
  }
  pfStack_10c8 = (fdb_kvs_handle *)compact_reopen_with_iterator;
  compact_reopen_named_kvs();
  pfStack_15d0 = (fdb_kvs_handle *)0x10d8fa;
  ppfStack_10f0 = &pfStack_10b8;
  pbStack_10e8 = unaff_R12;
  sStack_10e0 = unaff_R13;
  pfStack_10d8 = &fStack_10a8;
  ppfStack_10d0 = &pfStack_10b0;
  pfStack_10c8 = unaff_RBP;
  gettimeofday((timeval *)(auStack_1590 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_15d0 = (fdb_kvs_handle *)0x10d8ff;
  memleak_start();
  pfStack_15a8 = (fdb_kvs_handle *)0x0;
  pfStack_15d0 = (fdb_kvs_handle *)0x10d914;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_15d0 = (fdb_kvs_handle *)0x10d924;
  fdb_get_default_config();
  pfVar10 = (fdb_kvs_handle *)auStack_1590;
  pfStack_15d0 = (fdb_kvs_handle *)0x10d931;
  fdb_get_default_kvs_config();
  fStack_14f0.wal_threshold = 0x400;
  fStack_14f0.flags = 1;
  fStack_14f0.compaction_threshold = '\0';
  pbVar8 = (btree *)auStack_15a0;
  pfStack_15d0 = (fdb_kvs_handle *)0x10d95b;
  fdb_open((fdb_file_handle **)pbVar8,"./compact_test1",&fStack_14f0);
  ppfVar19 = &pfStack_15b8;
  pfStack_15d0 = (fdb_kvs_handle *)0x10d975;
  fdb_kvs_open((fdb_file_handle *)auStack_15a0._0_8_,ppfVar19,"db",(fdb_kvs_config *)pfVar10);
  pfStack_15d0 = (fdb_kvs_handle *)0x10d98b;
  pfVar28 = pfStack_15b8;
  fVar4 = fdb_set_log_callback(pfStack_15b8,logCallbackFunc,"compact_reopen_with_iterator");
  uVar21 = (uint)pfVar28;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (btree *)0x0;
    uVar16 = 0;
    do {
      pfVar1 = &fStack_12f8.config.encryption_key;
      pfStack_15d0 = (fdb_kvs_handle *)0x10d9b3;
      sprintf((char *)pfVar1,"key%d",uVar16 & 0xffffffff);
      pfStack_15d0 = (fdb_kvs_handle *)0x10d9cb;
      sprintf((char *)&fStack_12f8,"meta%d",uVar16 & 0xffffffff);
      pfStack_15d0 = (fdb_kvs_handle *)0x10d9e3;
      sprintf(acStack_13f8,"body%d",uVar16 & 0xffffffff);
      pbVar8 = (btree *)(&bStack_1568.ksize + (long)unaff_R12);
      pfStack_15d0 = (fdb_kvs_handle *)0x10d9f3;
      unaff_R13 = strlen((char *)pfVar1);
      unaff_RBP = &fStack_12f8;
      pfStack_15d0 = (fdb_kvs_handle *)0x10da06;
      pfVar10 = (fdb_kvs_handle *)strlen((char *)unaff_RBP);
      pfStack_15d0 = (fdb_kvs_handle *)0x10da16;
      sVar6 = strlen(acStack_13f8);
      pfStack_15d0 = (fdb_kvs_handle *)0x10da3b;
      fdb_doc_create((fdb_doc **)pbVar8,&fStack_12f8.config.encryption_key,unaff_R13,unaff_RBP,
                     (size_t)pfVar10,acStack_13f8,sVar6);
      pfStack_15d0 = (fdb_kvs_handle *)0x10da4a;
      fdb_set(pfStack_15b8,*(fdb_doc **)(&bStack_1568.ksize + uVar16 * 8));
      uVar16 = uVar16 + 1;
      unaff_R12 = (btree *)((long)unaff_R12 + 8);
    } while (uVar16 != 9);
    pfStack_15d0 = (fdb_kvs_handle *)0x10da67;
    fdb_commit((fdb_file_handle *)auStack_15a0._0_8_,'\0');
    ppfVar19 = (fdb_kvs_handle **)(auStack_15a0 + 8);
    pfStack_15d0 = (fdb_kvs_handle *)0x10da83;
    fdb_open((fdb_file_handle **)ppfVar19,"./compact_test1",&fStack_14f0);
    pfStack_15d0 = (fdb_kvs_handle *)0x10da92;
    pfVar24 = (fdb_file_handle *)auStack_15a0._8_8_;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_15a0._8_8_,"./compact_test2");
    uVar21 = (uint)pfVar24;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010dcb5;
    pfStack_15d0 = (fdb_kvs_handle *)0x10daa4;
    fdb_close((fdb_file_handle *)auStack_15a0._8_8_);
    pfStack_15d0 = (fdb_kvs_handle *)0x10dac4;
    pfVar28 = pfStack_15b8;
    fVar4 = fdb_iterator_init(pfStack_15b8,&pfStack_15b0,(void *)0x0,0,(void *)0x0,0,0);
    uVar21 = (uint)pfVar28;
    pfVar28 = pfVar10;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010dcba;
    unaff_R13 = 0;
    ppfVar19 = &pfStack_15a8;
    do {
      pfStack_15d0 = (fdb_kvs_handle *)0x10dae1;
      fVar4 = fdb_iterator_get(pfStack_15b0,(fdb_doc **)ppfVar19);
      pfVar28 = pfStack_15a8;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0010dc95:
        pfStack_15d0 = (fdb_kvs_handle *)0x10dc9a;
        compact_reopen_with_iterator();
LAB_0010dc9a:
        pfStack_15d0 = (fdb_kvs_handle *)0x10dca5;
        compact_reopen_with_iterator();
LAB_0010dca5:
        pfStack_15d0 = (fdb_kvs_handle *)0x10dcb0;
        pbVar26 = unaff_R12;
        compact_reopen_with_iterator();
        uVar21 = (uint)pbVar26;
        goto LAB_0010dcb0;
      }
      pbVar8 = (btree *)pfStack_15a8->op_stats;
      unaff_RBP = *(fdb_kvs_handle **)(&bStack_1568.ksize + unaff_R13 * 8);
      unaff_R12 = (btree *)unaff_RBP->op_stats;
      pfStack_15d0 = (fdb_kvs_handle *)0x10db09;
      iVar5 = bcmp(pbVar8,unaff_R12,*(size_t *)&pfStack_15a8->kvs_config);
      pfVar10 = pfVar28;
      if (iVar5 != 0) {
        pfStack_15d0 = (fdb_kvs_handle *)0x10dc95;
        compact_reopen_with_iterator();
        goto LAB_0010dc95;
      }
      pbVar8 = pfVar28->staletree;
      unaff_R12 = unaff_RBP->staletree;
      pfStack_15d0 = (fdb_kvs_handle *)0x10db28;
      iVar5 = bcmp(pbVar8,unaff_R12,(size_t)(pfVar28->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_0010dca5;
      pbVar8 = (pfVar28->field_6).seqtree;
      unaff_R12 = (unaff_RBP->field_6).seqtree;
      pfStack_15d0 = (fdb_kvs_handle *)0x10db47;
      iVar5 = bcmp(pbVar8,unaff_R12,(size_t)(pfVar28->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_0010dc9a;
      pfStack_15d0 = (fdb_kvs_handle *)0x10db57;
      fdb_doc_free((fdb_doc *)pfVar28);
      pfStack_15a8 = (fdb_kvs_handle *)0x0;
      unaff_R13 = unaff_R13 + 1;
      pfStack_15d0 = (fdb_kvs_handle *)0x10db6d;
      pfVar25 = pfStack_15b0;
      fVar4 = fdb_iterator_next(pfStack_15b0);
      uVar21 = (uint)pfVar25;
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 != 9) goto LAB_0010dcbf;
    pfStack_15d0 = (fdb_kvs_handle *)0x10db8a;
    fVar4 = fdb_iterator_close(pfStack_15b0);
    uVar21 = (uint)pfStack_15b0;
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_15d0 = (fdb_kvs_handle *)0x10dbaa;
      fdb_get_kvs_info(pfStack_15b8,&fStack_1520);
      lVar17 = (long)(int)fStack_1520.doc_count;
      pfStack_15d0 = (fdb_kvs_handle *)0x10dbb6;
      fdb_kvs_close(pfStack_15b8);
      pfStack_15d0 = (fdb_kvs_handle *)0x10dbc4;
      fdb_close((fdb_file_handle *)auStack_15a0._0_8_);
      pfStack_15d0 = (fdb_kvs_handle *)0x10dbdb;
      fdb_open((fdb_file_handle **)auStack_15a0,"./compact_test2",&fStack_14f0);
      pfStack_15d0 = (fdb_kvs_handle *)0x10dbf3;
      fdb_kvs_open((fdb_file_handle *)auStack_15a0._0_8_,&pfStack_15b8,"db",
                   (fdb_kvs_config *)auStack_1590);
      pfStack_15d0 = (fdb_kvs_handle *)0x10dbfe;
      fdb_get_kvs_info(pfStack_15b8,&fStack_1520);
      if (lVar17 != CONCAT44(fStack_1520.doc_count._4_4_,(int)fStack_1520.doc_count)) {
        pfStack_15d0 = (fdb_kvs_handle *)0x10dc14;
        compact_reopen_with_iterator();
      }
      pfStack_15d0 = (fdb_kvs_handle *)0x10dc1e;
      fdb_kvs_close(pfStack_15b8);
      pfStack_15d0 = (fdb_kvs_handle *)0x10dc28;
      fdb_close((fdb_file_handle *)auStack_15a0._0_8_);
      lVar17 = 0;
      do {
        pfStack_15d0 = (fdb_kvs_handle *)0x10dc34;
        fdb_doc_free(*(fdb_doc **)(&bStack_1568.ksize + lVar17 * 8));
        lVar17 = lVar17 + 1;
      } while (lVar17 != 9);
      pfStack_15d0 = (fdb_kvs_handle *)0x10dc42;
      fdb_shutdown();
      pfStack_15d0 = (fdb_kvs_handle *)0x10dc47;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (compact_reopen_with_iterator()::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_15d0 = (fdb_kvs_handle *)0x10dc78;
      fprintf(_stderr,pcVar23,"compact reopen with iterator");
      return;
    }
  }
  else {
LAB_0010dcb0:
    pfStack_15d0 = (fdb_kvs_handle *)0x10dcb5;
    compact_reopen_with_iterator();
LAB_0010dcb5:
    pfStack_15d0 = (fdb_kvs_handle *)0x10dcba;
    compact_reopen_with_iterator();
    pfVar28 = pfVar10;
LAB_0010dcba:
    pfStack_15d0 = (fdb_kvs_handle *)0x10dcbf;
    compact_reopen_with_iterator();
LAB_0010dcbf:
    pfStack_15d0 = (fdb_kvs_handle *)0x10dcc4;
    compact_reopen_with_iterator();
  }
  pfStack_15d0 = (fdb_kvs_handle *)estimate_space_upto_test;
  compact_reopen_with_iterator();
  pcStack_23e8 = (code *)0x10dceb;
  ppfStack_15f8 = ppfVar19;
  pbStack_15f0 = unaff_R12;
  sStack_15e8 = unaff_R13;
  pfStack_15e0 = pfVar28;
  pbStack_15d8 = pbVar8;
  pfStack_15d0 = unaff_RBP;
  gettimeofday(&tStack_2370,(__timezone_ptr_t)0x0);
  pcStack_23e8 = (code *)0x10dcf0;
  memleak_start();
  pcStack_23e8 = (code *)0x10dd00;
  fdb_get_default_config();
  pcStack_23e8 = (code *)0x10dd0a;
  fdb_get_default_kvs_config();
  fStack_2058.buffercache_size = 0;
  fStack_2058.wal_threshold = 0x32;
  fStack_2058.flags = 1;
  fStack_2058.compaction_threshold = '\0';
  fStack_2058.block_reusing_threshold = 0;
  pcStack_23e8 = (code *)0x10dd38;
  fStack_2058.multi_kv_instances = (bool)(char)uVar21;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_23e8 = (code *)0x10dd4c;
  fdb_open(&pfStack_23d0,"./compact_test1",&fStack_2058);
  uStack_23b4 = uVar21;
  if (uVar21 == 0) {
    pcStack_23e8 = (code *)0x10ddb8;
    fdb_kvs_open_default(pfStack_23d0,apfStack_23b0,&fStack_2390);
    sVar18 = 1;
  }
  else {
    ppfVar19 = apfStack_23b0;
    uVar16 = 0;
    do {
      pcStack_23e8 = (code *)0x10dd7d;
      sprintf(acStack_2378,"kv%d",uVar16 & 0xffffffff);
      pcStack_23e8 = (code *)0x10dd90;
      fdb_kvs_open(pfStack_23d0,ppfVar19,acStack_2378,&fStack_2390);
      uVar16 = uVar16 + 1;
      ppfVar19 = ppfVar19 + 1;
    } while (uVar16 != 4);
    sVar18 = 4;
  }
  uVar16 = 0;
  do {
    pcStack_23e8 = (code *)0x10dddc;
    sprintf(acStack_2160,"key%d",uVar16 & 0xffffffff);
    pcStack_23e8 = (code *)0x10ddf5;
    sprintf(acStack_2260,"meta%d",uVar16 & 0xffffffff);
    pcStack_23e8 = (code *)0x10de0e;
    sprintf(acStack_2360,"body%d",uVar16 & 0xffffffff);
    pcStack_23e8 = (code *)0x10de21;
    sVar6 = strlen(acStack_2160);
    pcStack_23e8 = (code *)0x10de34;
    sVar7 = strlen(acStack_2260);
    pcStack_23e8 = (code *)0x10de44;
    sVar9 = strlen(acStack_2360);
    pcStack_23e8 = (code *)0x10de69;
    fdb_doc_create(apfStack_1f60 + uVar16,acStack_2160,sVar6,acStack_2260,sVar7,acStack_2360,sVar9);
    sVar32 = 0;
    do {
      pcStack_23e8 = (code *)0x10de7a;
      fdb_set(apfStack_23b0[sVar32],apfStack_1f60[uVar16]);
      sVar32 = sVar32 + 1;
    } while (sVar18 != sVar32);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0x4b);
  pcStack_23e8 = (code *)0x10de9e;
  fdb_commit(pfStack_23d0,'\x01');
  uVar16 = 0x4b;
  do {
    pcStack_23e8 = (code *)0x10dec0;
    sprintf(acStack_2160,"key%d",uVar16 & 0xffffffff);
    pcStack_23e8 = (code *)0x10ded9;
    sprintf(acStack_2260,"meta%d",uVar16 & 0xffffffff);
    pcStack_23e8 = (code *)0x10def2;
    sprintf(acStack_2360,"body%d",uVar16 & 0xffffffff);
    pcStack_23e8 = (code *)0x10df05;
    sVar6 = strlen(acStack_2160);
    pcStack_23e8 = (code *)0x10df18;
    sVar7 = strlen(acStack_2260);
    pcStack_23e8 = (code *)0x10df28;
    sVar9 = strlen(acStack_2360);
    pcStack_23e8 = (code *)0x10df4d;
    fdb_doc_create(apfStack_1f60 + uVar16,acStack_2160,sVar6,acStack_2260,sVar7,acStack_2360,sVar9);
    sVar32 = 0;
    do {
      pcStack_23e8 = (code *)0x10df5e;
      fdb_set(apfStack_23b0[sVar32],apfStack_1f60[uVar16]);
      sVar32 = sVar32 + 1;
    } while (sVar18 != sVar32);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0x96);
  lVar17 = 0;
  do {
    sVar32 = 0;
    do {
      pcStack_23e8 = (code *)0x10df8e;
      fdb_set(apfStack_23b0[sVar32],apfStack_1f60[lVar17]);
      sVar32 = sVar32 + 1;
    } while (sVar18 != sVar32);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0x4b);
  lVar17 = 0;
  do {
    sVar32 = 0;
    do {
      pcStack_23e8 = (code *)0x10dfb7;
      fdb_set(apfStack_23b0[sVar32],apfStack_1f60[lVar17]);
      sVar32 = sVar32 + 1;
    } while (sVar18 != sVar32);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0x4b);
  pcStack_23e8 = (code *)0x10dfd4;
  fdb_commit(pfStack_23d0,'\0');
  uVar16 = 0x96;
  do {
    pcStack_23e8 = (code *)0x10dff6;
    sprintf(acStack_2160,"key%d",uVar16 & 0xffffffff);
    pcStack_23e8 = (code *)0x10e00f;
    sprintf(acStack_2260,"meta%d",uVar16 & 0xffffffff);
    pcStack_23e8 = (code *)0x10e028;
    sprintf(acStack_2360,"body%d",uVar16 & 0xffffffff);
    pcStack_23e8 = (code *)0x10e03b;
    sVar6 = strlen(acStack_2160);
    pcStack_23e8 = (code *)0x10e04e;
    sVar7 = strlen(acStack_2260);
    pcStack_23e8 = (code *)0x10e05e;
    sVar9 = strlen(acStack_2360);
    pcStack_23e8 = (code *)0x10e083;
    fdb_doc_create(apfStack_1f60 + uVar16,acStack_2160,sVar6,acStack_2260,sVar7,acStack_2360,sVar9);
    sVar32 = 0;
    do {
      pcStack_23e8 = (code *)0x10e094;
      fdb_set(apfStack_23b0[sVar32],apfStack_1f60[uVar16]);
      sVar32 = sVar32 + 1;
    } while (sVar18 != sVar32);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0xe1);
  pcStack_23e8 = (code *)0x10e0bb;
  fdb_commit(pfStack_23d0,'\x01');
  uVar16 = 0xe1;
  do {
    pcStack_23e8 = (code *)0x10e0dd;
    sprintf(acStack_2160,"key%d",uVar16 & 0xffffffff);
    pcStack_23e8 = (code *)0x10e0f6;
    sprintf(acStack_2260,"meta%d",uVar16 & 0xffffffff);
    pcStack_23e8 = (code *)0x10e10f;
    sprintf(acStack_2360,"body%d",uVar16 & 0xffffffff);
    ppfVar35 = apfStack_1f60 + uVar16;
    pcStack_23e8 = (code *)0x10e122;
    sVar6 = strlen(acStack_2160);
    pcStack_23e8 = (code *)0x10e135;
    sVar7 = strlen(acStack_2260);
    pcStack_23e8 = (code *)0x10e145;
    sVar9 = strlen(acStack_2360);
    pcStack_23e8 = (code *)0x10e16a;
    fdb_doc_create(ppfVar35,acStack_2160,sVar6,acStack_2260,sVar7,acStack_2360,sVar9);
    sVar32 = 0;
    do {
      pcStack_23e8 = (code *)0x10e17b;
      fdb_set(apfStack_23b0[sVar32],*ppfVar35);
      sVar32 = sVar32 + 1;
    } while (sVar18 != sVar32);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 300);
  sVar32 = 0;
  pcStack_23e8 = (code *)0x10e1a2;
  fdb_commit(pfStack_23d0,'\0');
  do {
    pfVar10 = apfStack_23b0[sVar32];
    pcStack_23e8 = (code *)0x10e1c0;
    fVar4 = fdb_set_log_callback(pfVar10,logCallbackFunc,"estimate_space_upto_test");
    iVar5 = (int)pfVar10;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pcStack_23e8 = (code *)0x10e337;
      estimate_space_upto_test();
      goto LAB_0010e337;
    }
    sVar32 = sVar32 + 1;
  } while (sVar18 != sVar32);
  pcStack_23e8 = (code *)0x10e1e4;
  pfVar24 = pfStack_23d0;
  fVar4 = fdb_get_all_snap_markers(pfStack_23d0,&pfStack_23c8,&uStack_23c0);
  iVar5 = (int)pfVar24;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    sVar6 = (size_t)uStack_23b4;
    cVar20 = (char)uStack_23b4;
    uVar12 = uStack_23c0;
    if (cVar20 != '\0') {
      if (uStack_23c0 != 8) {
        pcStack_23e8 = (code *)0x10e20a;
        estimate_space_upto_test();
      }
      pcStack_23e8 = (code *)0x10e21d;
      sVar18 = fdb_estimate_space_used_from(pfStack_23d0,pfStack_23c8[1].marker);
      pcStack_23e8 = (code *)0x10e233;
      sVar11 = fdb_estimate_space_used_from(pfStack_23d0,pfStack_23c8[2].marker);
      if (sVar11 <= sVar18) {
        pcStack_23e8 = (code *)0x10e23d;
        estimate_space_upto_test();
        uVar12 = extraout_RAX;
        goto LAB_0010e23d;
      }
LAB_0010e27f:
      pcStack_23e8 = (code *)0x10e28e;
      fVar4 = fdb_free_snap_markers(pfStack_23c8,uStack_23c0);
      iVar5 = (int)pfStack_23c8;
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pcStack_23e8 = (code *)0x10e2a0;
        fdb_close(pfStack_23d0);
        lVar17 = 0;
        do {
          pcStack_23e8 = (code *)0x10e2af;
          fdb_doc_free(apfStack_1f60[lVar17]);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 300);
        pcStack_23e8 = (code *)0x10e2c0;
        fdb_shutdown();
        pcStack_23e8 = (code *)0x10e2c5;
        memleak_end();
        pcVar23 = "single kv mode:";
        if (cVar20 != '\0') {
          pcVar23 = "multiple kv mode:";
        }
        pcStack_23e8 = (code *)0x10e2f3;
        sprintf(acStack_2360,"estimate space upto marker in file test %s",pcVar23);
        pcVar23 = "%s PASSED\n";
        if (estimate_space_upto_test(bool)::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        pcStack_23e8 = (code *)0x10e320;
        fprintf(_stderr,pcVar23,acStack_2360);
        return;
      }
      goto LAB_0010e33c;
    }
LAB_0010e23d:
    if (uVar12 != 4) {
      pcStack_23e8 = (code *)0x10e24d;
      estimate_space_upto_test();
    }
    pcStack_23e8 = (code *)0x10e260;
    sVar18 = fdb_estimate_space_used_from(pfStack_23d0,pfStack_23c8[1].marker);
    pcStack_23e8 = (code *)0x10e276;
    pfVar24 = pfStack_23d0;
    sVar11 = fdb_estimate_space_used_from(pfStack_23d0,pfStack_23c8[2].marker);
    iVar5 = (int)pfVar24;
    if (sVar18 < sVar11) goto LAB_0010e27f;
  }
  else {
LAB_0010e337:
    pcStack_23e8 = (code *)0x10e33c;
    estimate_space_upto_test();
LAB_0010e33c:
    pcStack_23e8 = (code *)0x10e341;
    estimate_space_upto_test();
  }
  pcStack_23e8 = compact_upto_test;
  estimate_space_upto_test();
  pcStack_23f0 = logCallbackFunc;
  pcStack_23f8 = "estimate_space_upto_test";
  pfStack_2970 = (fdb_kvs_handle *)0x10e36b;
  sStack_2410 = sVar18;
  sStack_2408 = sVar32;
  ppfStack_2400 = ppfVar35;
  pcStack_23e8 = (code *)sVar6;
  gettimeofday(&tStack_28b8,(__timezone_ptr_t)0x0);
  pfStack_2970 = (fdb_kvs_handle *)0x10e370;
  memleak_start();
  pfStack_2970 = (fdb_kvs_handle *)0x10e380;
  fdb_get_default_config();
  pfStack_2970 = (fdb_kvs_handle *)0x10e38d;
  fdb_get_default_kvs_config();
  uStack_2500 = 0;
  uStack_24f8 = 0x400;
  uStack_24e4 = 1;
  uStack_24d9 = 0;
  uStack_2450 = 0;
  pfStack_2970 = (fdb_kvs_handle *)0x10e3bb;
  uStack_24c8 = (char)iVar5;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2970 = (fdb_kvs_handle *)0x10e3cf;
  fdb_open(&pfStack_2950,"./compact_test1",(fdb_config *)(auStack_2708 + 0x200));
  iStack_293c = iVar5;
  if (iVar5 == 0) {
    pfStack_2970 = (fdb_kvs_handle *)0x10e441;
    fdb_kvs_open_default(pfStack_2950,(fdb_kvs_handle **)(auStack_2938 + 0x20),&fStack_28d0);
    uVar21 = 1;
  }
  else {
    ppfVar19 = (fdb_kvs_handle **)(auStack_2938 + 0x20);
    uVar16 = 0;
    do {
      pfStack_2970 = (fdb_kvs_handle *)0x10e403;
      sprintf(auStack_2938,"kv%d",uVar16 & 0xffffffff);
      pfStack_2970 = (fdb_kvs_handle *)0x10e416;
      fdb_kvs_open(pfStack_2950,ppfVar19,auStack_2938,&fStack_28d0);
      uVar16 = uVar16 + 1;
      ppfVar19 = ppfVar19 + 1;
    } while (uVar16 != 4);
    uVar21 = 4;
  }
  pcVar23 = (char *)(ulong)uVar21;
  uVar16 = 0;
  do {
    pfStack_2970 = (fdb_kvs_handle *)0x10e466;
    sprintf(auStack_2708 + 0x100,"key%d",uVar16 & 0xffffffff);
    pfStack_2970 = (fdb_kvs_handle *)0x10e47e;
    sprintf(auStack_2708,"meta%d",uVar16 & 0xffffffff);
    pfStack_2970 = (fdb_kvs_handle *)0x10e496;
    sprintf(acStack_28a8,"body%d",uVar16 & 0xffffffff);
    pfStack_2970 = (fdb_kvs_handle *)0x10e4a9;
    sVar6 = strlen(auStack_2708 + 0x100);
    pfStack_2970 = (fdb_kvs_handle *)0x10e4bc;
    sVar7 = strlen(auStack_2708);
    pfStack_2970 = (fdb_kvs_handle *)0x10e4cc;
    sVar9 = strlen(acStack_28a8);
    pfStack_2970 = (fdb_kvs_handle *)0x10e4f1;
    fdb_doc_create(apfStack_27a8 + uVar16,auStack_2708 + 0x100,sVar6,auStack_2708,sVar7,acStack_28a8
                   ,sVar9);
    lVar17 = 0;
    do {
      pfStack_2970 = (fdb_kvs_handle *)0x10e501;
      fdb_set(*(fdb_kvs_handle **)(auStack_2938 + lVar17 * 8 + 0x20),apfStack_27a8[uVar16]);
      lVar17 = lVar17 + 1;
    } while (pcVar23 != (char *)lVar17);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 5);
  pfStack_2970 = (fdb_kvs_handle *)0x10e525;
  fdb_commit(pfStack_2950,'\x01');
  uVar16 = 5;
  do {
    pfStack_2970 = (fdb_kvs_handle *)0x10e545;
    sprintf(auStack_2708 + 0x100,"key%d",uVar16 & 0xffffffff);
    pfStack_2970 = (fdb_kvs_handle *)0x10e55d;
    sprintf(auStack_2708,"meta%d",uVar16 & 0xffffffff);
    pfStack_2970 = (fdb_kvs_handle *)0x10e575;
    sprintf(acStack_28a8,"body%d",uVar16 & 0xffffffff);
    pfStack_2970 = (fdb_kvs_handle *)0x10e588;
    sVar6 = strlen(auStack_2708 + 0x100);
    pfStack_2970 = (fdb_kvs_handle *)0x10e59b;
    sVar7 = strlen(auStack_2708);
    pfStack_2970 = (fdb_kvs_handle *)0x10e5ab;
    sVar9 = strlen(acStack_28a8);
    pfStack_2970 = (fdb_kvs_handle *)0x10e5d0;
    fdb_doc_create(apfStack_27a8 + uVar16,auStack_2708 + 0x100,sVar6,auStack_2708,sVar7,acStack_28a8
                   ,sVar9);
    lVar17 = 0;
    do {
      pfStack_2970 = (fdb_kvs_handle *)0x10e5e1;
      fdb_set(*(fdb_kvs_handle **)(auStack_2938 + lVar17 * 8 + 0x20),apfStack_27a8[uVar16]);
      lVar17 = lVar17 + 1;
    } while (pcVar23 != (char *)lVar17);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 10);
  pfStack_2970 = (fdb_kvs_handle *)0x10e602;
  fdb_commit(pfStack_2950,'\0');
  uVar16 = 10;
  do {
    pfStack_2970 = (fdb_kvs_handle *)0x10e622;
    sprintf(auStack_2708 + 0x100,"key%d",uVar16 & 0xffffffff);
    pfStack_2970 = (fdb_kvs_handle *)0x10e63a;
    sprintf(auStack_2708,"meta%d",uVar16 & 0xffffffff);
    pfStack_2970 = (fdb_kvs_handle *)0x10e652;
    sprintf(acStack_28a8,"body%d",uVar16 & 0xffffffff);
    pfStack_2970 = (fdb_kvs_handle *)0x10e665;
    sVar6 = strlen(auStack_2708 + 0x100);
    pfStack_2970 = (fdb_kvs_handle *)0x10e678;
    sVar7 = strlen(auStack_2708);
    pfStack_2970 = (fdb_kvs_handle *)0x10e688;
    sVar9 = strlen(acStack_28a8);
    pfStack_2970 = (fdb_kvs_handle *)0x10e6ad;
    fdb_doc_create(apfStack_27a8 + uVar16,auStack_2708 + 0x100,sVar6,auStack_2708,sVar7,acStack_28a8
                   ,sVar9);
    lVar17 = 0;
    do {
      pfStack_2970 = (fdb_kvs_handle *)0x10e6be;
      fdb_set(*(fdb_kvs_handle **)(auStack_2938 + lVar17 * 8 + 0x20),apfStack_27a8[uVar16]);
      lVar17 = lVar17 + 1;
    } while (pcVar23 != (char *)lVar17);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0xf);
  pfStack_2970 = (fdb_kvs_handle *)0x10e6e2;
  fdb_commit(pfStack_2950,'\x01');
  uVar16 = 0xf;
  do {
    pfStack_2970 = (fdb_kvs_handle *)0x10e702;
    sprintf(auStack_2708 + 0x100,"key%d",uVar16 & 0xffffffff);
    pfStack_2970 = (fdb_kvs_handle *)0x10e71a;
    sprintf(auStack_2708,"meta%d",uVar16 & 0xffffffff);
    pfStack_2970 = (fdb_kvs_handle *)0x10e732;
    sprintf(acStack_28a8,"body%d",uVar16 & 0xffffffff);
    pfStack_2970 = (fdb_kvs_handle *)0x10e745;
    pfVar10 = (fdb_kvs_handle *)strlen(auStack_2708 + 0x100);
    doc._M_i = (__int_type_conflict)auStack_2708;
    pfStack_2970 = (fdb_kvs_handle *)0x10e758;
    sVar6 = strlen((char *)doc._M_i);
    pfStack_2970 = (fdb_kvs_handle *)0x10e768;
    sVar7 = strlen(acStack_28a8);
    pfStack_2970 = (fdb_kvs_handle *)0x10e78d;
    fdb_doc_create(apfStack_27a8 + uVar16,auStack_2708 + 0x100,(size_t)pfVar10,(void *)doc._M_i,
                   sVar6,acStack_28a8,sVar7);
    lVar17 = 0;
    do {
      pfStack_2970 = (fdb_kvs_handle *)0x10e79e;
      fdb_set(*(fdb_kvs_handle **)(auStack_2938 + lVar17 * 8 + 0x20),apfStack_27a8[uVar16]);
      lVar17 = lVar17 + 1;
    } while (pcVar23 != (char *)lVar17);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0x14);
  pfVar28 = (fdb_kvs_handle *)0x0;
  pfStack_2970 = (fdb_kvs_handle *)0x10e7c2;
  fdb_commit(pfStack_2950,'\0');
  __s = logCallbackFunc;
  pcVar33 = "compact_upto_test";
  do {
    pfStack_2970 = (fdb_kvs_handle *)0x10e7e0;
    fVar4 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_2938 + (long)pfVar28 * 8 + 0x20),logCallbackFunc
                       ,"compact_upto_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010eb2a;
    pfVar28 = (fdb_kvs_handle *)&(pfVar28->kvs_config).field_0x1;
  } while ((fdb_kvs_handle *)pcVar23 != pfVar28);
  pfStack_2970 = (fdb_kvs_handle *)0x10e804;
  fVar4 = fdb_get_all_snap_markers
                    (pfStack_2950,(fdb_snapshot_info_t **)&aStack_2958.seqtree,
                     (uint64_t *)&pfStack_2948);
  pcVar34 = pcVar33;
  if (fVar4 == FDB_RESULT_SUCCESS) {
    if ((char)iStack_293c == '\0') {
      if (pfStack_2948 != (fdb_kvs_handle *)0x4) {
        pfStack_2970 = (fdb_kvs_handle *)0x10e92b;
        compact_upto_test();
      }
      pfVar28 = (fdb_kvs_handle *)0x1400000000;
      doc._M_i = 0;
      pfVar10 = (fdb_kvs_handle *)0xfffffffb00000000;
      pcVar23 = auStack_2938 + 0x40;
      pcVar34 = (char *)0x0;
      aVar13 = aStack_2958;
      do {
        if (*(long *)((long)&(aVar13.seqtree)->root_bid + doc._M_i) != 1) {
          pfStack_2970 = (fdb_kvs_handle *)0x10e98d;
          compact_upto_test();
          aVar13 = aStack_28f8;
        }
        if (*(long *)(*(long *)((long)&(aVar13.seqtree)->blk_handle + doc._M_i) + 8) !=
            (long)pfVar28 >> 0x20) {
          pfStack_2970 = (fdb_kvs_handle *)0x10e9a2;
          compact_upto_test();
          aVar13 = aStack_28f8;
        }
        pcVar34 = (char *)((long)pcVar34 + 1);
        pfVar28 = (fdb_kvs_handle *)(pfVar28[-0x2762763].config.encryption_key.bytes + 0x14);
        doc._M_i = doc._M_i + 0x18;
      } while (pcVar34 < pfStack_2948);
      __s = (code *)(auStack_2938 + 0x40);
      pfStack_2970 = (fdb_kvs_handle *)0x10e9c4;
      sprintf((char *)__s,"compact_test_compact%d",1);
      pfStack_2970 = (fdb_kvs_handle *)0x10e9da;
      fVar4 = fdb_compact_upto(pfStack_2950,(char *)__s,
                               (fdb_snapshot_marker_t)(aStack_2958.seqtree)->blk_ops);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pfStack_2970 = (fdb_kvs_handle *)0x10e9fe;
        fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2938._32_8_,
                                  (fdb_kvs_handle **)(auStack_2938 + 0x18),
                                  (fdb_seqnum_t)(aStack_2958.seqtrie)->btree_blk_ops->blk_alloc_sub)
        ;
        if (fVar4 != FDB_RESULT_SUCCESS) {
          pfStack_2970 = (fdb_kvs_handle *)0x10ea07;
          compact_upto_test();
          goto LAB_0010ea07;
        }
LAB_0010ea64:
        __s = (code *)(auStack_2938 + 0x40);
        pfStack_2970 = (fdb_kvs_handle *)0x10ea6e;
        fdb_kvs_close((fdb_kvs_handle *)auStack_2938._24_8_);
        pfStack_2970 = (fdb_kvs_handle *)0x10ea7d;
        fVar4 = fdb_free_snap_markers
                          ((fdb_snapshot_info_t *)aStack_2958.seqtree,(uint64_t)pfStack_2948);
        if (fVar4 == FDB_RESULT_SUCCESS) {
          pfStack_2970 = (fdb_kvs_handle *)0x10ea8f;
          fdb_close(pfStack_2950);
          lVar17 = 0;
          do {
            pfStack_2970 = (fdb_kvs_handle *)0x10ea9e;
            fdb_doc_free(apfStack_27a8[lVar17]);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0x14);
          pfStack_2970 = (fdb_kvs_handle *)0x10eaac;
          fdb_shutdown();
          pfStack_2970 = (fdb_kvs_handle *)0x10eab1;
          memleak_end();
          pcVar23 = "single kv mode:";
          if ((char)iStack_293c != '\0') {
            pcVar23 = "multiple kv mode:";
          }
          pfStack_2970 = (fdb_kvs_handle *)0x10eae1;
          sprintf(acStack_28a8,"compact upto marker in file test %s",pcVar23);
          pcVar23 = "%s PASSED\n";
          if (compact_upto_test(bool)::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_2970 = (fdb_kvs_handle *)0x10eb0e;
          fprintf(_stderr,pcVar23,acStack_28a8);
          return;
        }
        goto LAB_0010eb34;
      }
      goto LAB_0010eb39;
    }
    if (pfStack_2948 != (fdb_kvs_handle *)0x8) {
      pfStack_2970 = (fdb_kvs_handle *)0x10e82c;
      compact_upto_test();
    }
    auStack_2938._8_8_ = ZEXT48(uVar21 + 1);
    doc._M_i = (__int_type_conflict)auStack_2938;
    pcVar34 = (char *)0x0;
    do {
      __s = (code *)((long)pcVar34 * 3);
      aVar13 = aStack_2958;
      if ((fdb_custom_cmp_variable)(&(aStack_2958.seqtree)->root_bid)[(long)pcVar34 * 3] !=
          (fdb_custom_cmp_variable)auStack_2938._8_8_) {
        pfStack_2970 = (fdb_kvs_handle *)0x10e911;
        compact_upto_test();
        aVar13 = aStack_28f8;
      }
      pfVar10 = (fdb_kvs_handle *)((long)pcVar34 * -5 + 0x14);
      pfVar15 = (fdb_kvs_commit_marker_t *)(&(aVar13.seqtree)->blk_handle)[(long)pcVar34 * 3];
      pfVar28 = (fdb_kvs_handle *)0x8;
      pcVar33 = (char *)0x0;
      auStack_2938._16_8_ = pcVar34;
      do {
        if (*(fdb_kvs_handle **)(&(pfVar28->kvs_config).create_if_missing + (long)pfVar15) !=
            pfVar10) {
          pfStack_2970 = (fdb_kvs_handle *)0x10e8e2;
          compact_upto_test();
        }
        pfStack_2970 = (fdb_kvs_handle *)0x10e892;
        sprintf((char *)doc._M_i,"kv%d",(ulong)pcVar33 & 0xffffffff);
        pfVar15 = (fdb_kvs_commit_marker_t *)(&(aStack_2958.seqtree)->blk_handle)[(long)pcVar34 * 3]
        ;
        psVar2 = *(short **)((long)&pfVar15[-1].seqnum + (long)pfVar28);
        if ((char)psVar2[1] != auStack_2938[2] || *psVar2 != auStack_2938._0_2_) {
          pfStack_2970 = (fdb_kvs_handle *)0x10eb2a;
          compact_upto_test();
          goto LAB_0010eb2a;
        }
        pcVar33 = pcVar33 + 1;
        pfVar28 = (fdb_kvs_handle *)&(pfVar28->kvs_config).custom_cmp_param;
      } while (pcVar23 != pcVar33);
      pcVar34 = (char *)(auStack_2938._16_8_ + 1);
    } while (pcVar34 != pcVar23);
LAB_0010ea07:
    __s = (code *)(auStack_2938 + 0x40);
    pfStack_2970 = (fdb_kvs_handle *)0x10ea22;
    sprintf((char *)__s,"compact_test_compact%d",1);
    pfStack_2970 = (fdb_kvs_handle *)0x10ea38;
    fVar4 = fdb_compact_upto(pfStack_2950,(char *)__s,
                             (fdb_snapshot_marker_t)(aStack_2958.seqtree)->blk_ops);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010eb3e;
    pfStack_2970 = (fdb_kvs_handle *)0x10ea5c;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2938._40_8_,
                              (fdb_kvs_handle **)(auStack_2938 + 0x18),
                              (fdb_seqnum_t)(aStack_2958.seqtrie)->btree_blk_ops->blk_read);
    if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_0010ea64;
  }
  else {
LAB_0010eb2f:
    pfStack_2970 = (fdb_kvs_handle *)0x10eb34;
    compact_upto_test();
LAB_0010eb34:
    pfStack_2970 = (fdb_kvs_handle *)0x10eb39;
    compact_upto_test();
LAB_0010eb39:
    pfStack_2970 = (fdb_kvs_handle *)0x10eb3e;
    compact_upto_test();
LAB_0010eb3e:
    pfStack_2970 = (fdb_kvs_handle *)0x10eb43;
    compact_upto_test();
  }
  pfStack_2970 = (fdb_kvs_handle *)auto_recover_compact_ok_test;
  compact_upto_test();
  pfStack_2e58 = (fdb_kvs_handle *)0x10eb65;
  pcStack_2998 = __s;
  pfStack_2990 = pfVar28;
  pfStack_2988 = (fdb_kvs_handle *)doc._M_i;
  pcStack_2980 = pcVar23;
  pcStack_2978 = pcVar34;
  pfStack_2970 = pfVar10;
  gettimeofday((timeval *)(auStack_2e08 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_2e58 = (fdb_kvs_handle *)0x10eb6a;
  memleak_start();
  pfStack_2e58 = (fdb_kvs_handle *)0x10eb76;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2e58 = (fdb_kvs_handle *)0x10eb86;
  fdb_get_default_config();
  pfVar14 = (fdb_kvs_handle *)auStack_2e08;
  pfStack_2e58 = (fdb_kvs_handle *)0x10eb93;
  fdb_get_default_kvs_config();
  fStack_2d98.buffercache_size = 0x1000000;
  fStack_2d98.wal_threshold = 0x400;
  fStack_2d98.flags = 1;
  fStack_2d98.compaction_threshold = '\0';
  pbVar8 = (btree *)&pfStack_2e38;
  pfStack_2e58 = (fdb_kvs_handle *)0x10ebc5;
  fdb_open((fdb_file_handle **)pbVar8,"./compact_test1",&fStack_2d98);
  ppfVar19 = &pfStack_2e48;
  pfStack_2e58 = (fdb_kvs_handle *)0x10ebd8;
  fdb_kvs_open_default(pfStack_2e38,ppfVar19,(fdb_kvs_config *)pfVar14);
  pfStack_2e58 = (fdb_kvs_handle *)0x10ebee;
  fVar4 = fdb_set_log_callback(pfStack_2e48,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_2e58 = (fdb_kvs_handle *)0x10ec12;
    fdb_open((fdb_file_handle **)auStack_2e28,"./compact_test1",&fStack_2d98);
    ppfVar19 = &pfStack_2e30;
    pfStack_2e58 = (fdb_kvs_handle *)0x10ec27;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_2e28._0_8_,ppfVar19,(fdb_kvs_config *)auStack_2e08);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ec3d;
    fVar4 = fdb_set_log_callback(pfStack_2e30,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f07d;
    pfStack_2e58 = (fdb_kvs_handle *)0x10ec60;
    sprintf(acStack_2aa0,"key%d",0);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ec7b;
    sprintf(acStack_2ba0,"meta%d",0);
    pbVar8 = abStack_2ca0;
    pfStack_2e58 = (fdb_kvs_handle *)0x10ec96;
    sprintf((char *)pbVar8,"body%d",0);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ec9e;
    sVar6 = strlen(acStack_2aa0);
    pfStack_2e58 = (fdb_kvs_handle *)0x10eca9;
    sVar7 = strlen(acStack_2ba0);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ecb4;
    sVar9 = strlen((char *)pbVar8);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ecd4;
    fdb_doc_create((fdb_doc **)(auStack_2e28 + 8),acStack_2aa0,sVar6,acStack_2ba0,sVar7,pbVar8,sVar9
                  );
    pfStack_2e58 = (fdb_kvs_handle *)0x10ece2;
    fdb_set(pfStack_2e48,(fdb_doc *)auStack_2e28._8_8_);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ecf8;
    sprintf(acStack_2aa0,"key%d",1);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ed0e;
    sprintf(acStack_2ba0,"meta%d",1);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ed24;
    sprintf((char *)pbVar8,"body%d",1);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ed2c;
    sVar6 = strlen(acStack_2aa0);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ed37;
    sVar7 = strlen(acStack_2ba0);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ed42;
    sVar9 = strlen((char *)pbVar8);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ed5f;
    fdb_doc_create((fdb_doc **)(auStack_2e28 + 0x10),acStack_2aa0,sVar6,acStack_2ba0,sVar7,pbVar8,
                   sVar9);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ed6e;
    fdb_set(pfStack_2e48,(fdb_doc *)auStack_2e28._16_8_);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ed9a;
    fdb_doc_create((fdb_doc **)&pfStack_2e40,
                   *(_func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t **)
                    (auStack_2e28._16_8_ + 0x20),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)auStack_2e28._16_8_,
                   *(btree_print_func **)(auStack_2e28._16_8_ + 0x38),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)
                            (auStack_2e28._16_8_ + 8),(void *)0x0,0);
    *(bool *)&pfStack_2e40->file = true;
    pfStack_2e58 = (fdb_kvs_handle *)0x10edac;
    fdb_set(pfStack_2e48,(fdb_doc *)pfStack_2e40);
    pfStack_2e58 = (fdb_kvs_handle *)0x10edb5;
    fdb_doc_free((fdb_doc *)pfStack_2e40);
    pfStack_2e58 = (fdb_kvs_handle *)0x10edc4;
    fdb_commit(pfStack_2e38,'\x01');
    pfStack_2e58 = (fdb_kvs_handle *)0x10edd5;
    fdb_compact(pfStack_2e38,"./compact_test2");
    pfStack_2e58 = (fdb_kvs_handle *)0x10ede1;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_2e58 = (fdb_kvs_handle *)0x10edf7;
    sprintf(acStack_2aa0,"key%d",2);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ee0d;
    sprintf(acStack_2ba0,"meta%d",2);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ee23;
    sprintf((char *)pbVar8,"body%d",2);
    pfVar28 = (fdb_kvs_handle *)(auStack_2e28 + 0x18);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ee30;
    doc._M_i = strlen(acStack_2aa0);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ee3b;
    pfVar10 = (fdb_kvs_handle *)strlen(acStack_2ba0);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ee46;
    sVar6 = strlen((char *)pbVar8);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ee61;
    fdb_doc_create((fdb_doc **)pfVar28,acStack_2aa0,doc._M_i,acStack_2ba0,(size_t)pfVar10,pbVar8,
                   sVar6);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ee6f;
    fdb_set(pfStack_2e48,(fdb_doc *)auStack_2e28._24_8_);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ee7e;
    fdb_commit(pfStack_2e38,'\x01');
    pfStack_2e58 = (fdb_kvs_handle *)0x10ee88;
    fdb_kvs_close(pfStack_2e48);
    ppfVar19 = &pfStack_2e30;
    pfStack_2e58 = (fdb_kvs_handle *)0x10ee95;
    fdb_kvs_close(pfStack_2e30);
    pfStack_2e58 = (fdb_kvs_handle *)0x10ee9f;
    fdb_close(pfStack_2e38);
    pfVar14 = (fdb_kvs_handle *)auStack_2e28;
    pfStack_2e58 = (fdb_kvs_handle *)0x10eeac;
    fdb_close((fdb_file_handle *)auStack_2e28._0_8_);
    pfStack_2e58 = (fdb_kvs_handle *)0x10eeb8;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_2e58 = (fdb_kvs_handle *)0x10eecf;
    fdb_open((fdb_file_handle **)pfVar14,"./compact_test1",&fStack_2d98);
    pfStack_2e58 = (fdb_kvs_handle *)0x10eedf;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_2e28._0_8_,ppfVar19,(fdb_kvs_config *)auStack_2e08);
    pfStack_2e58 = (fdb_kvs_handle *)0x10eef5;
    fVar4 = fdb_set_log_callback(pfStack_2e30,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      doc._M_i = 0;
      ppfVar19 = &pfStack_2e40;
      while( true ) {
        pfStack_2e58 = (fdb_kvs_handle *)0x10ef29;
        fdb_doc_create((fdb_doc **)ppfVar19,
                       (void *)(*(size_t **)(auStack_2e28 + doc._M_i * 8 + 8))[4],
                       **(size_t **)(auStack_2e28 + doc._M_i * 8 + 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_2e58 = (fdb_kvs_handle *)0x10ef38;
        fVar4 = fdb_get(pfStack_2e30,(fdb_doc *)pfStack_2e40);
        pfVar27 = pfStack_2e40;
        if ((fdb_kvs_handle *)doc._M_i != (fdb_kvs_handle *)0x1) break;
        if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010f073;
LAB_0010ef9e:
        pfStack_2e58 = (fdb_kvs_handle *)0x10efa6;
        fdb_doc_free((fdb_doc *)pfVar27);
        doc._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)doc._M_i)->kvs_config).field_0x1;
        pfVar14 = pfVar27;
        if ((undefined1 *)doc._M_i == (undefined1 *)0x3) {
          pfStack_2e58 = (fdb_kvs_handle *)0x10efc5;
          fdb_get_file_info((fdb_file_handle *)auStack_2e28._0_8_,&fStack_2de0);
          pfStack_2e58 = (fdb_kvs_handle *)0x10efd4;
          iVar5 = strcmp("./compact_test2",fStack_2de0.filename);
          if (iVar5 != 0) {
            pfStack_2e58 = (fdb_kvs_handle *)0x10efe2;
            auto_recover_compact_ok_test();
          }
          pfStack_2e58 = (fdb_kvs_handle *)0x10efec;
          fdb_kvs_close(pfStack_2e30);
          pfStack_2e58 = (fdb_kvs_handle *)0x10eff6;
          fdb_close((fdb_file_handle *)auStack_2e28._0_8_);
          lVar17 = 0;
          do {
            pfStack_2e58 = (fdb_kvs_handle *)0x10f002;
            fdb_doc_free(*(fdb_doc **)(auStack_2e28 + lVar17 * 8 + 8));
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          pfStack_2e58 = (fdb_kvs_handle *)0x10f010;
          fdb_shutdown();
          pfStack_2e58 = (fdb_kvs_handle *)0x10f015;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_2e58 = (fdb_kvs_handle *)0x10f046;
          fprintf(_stderr,pcVar23,"auto recovery after compaction test");
          return;
        }
      }
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pbVar8 = pfStack_2e40->staletree;
        pfVar10 = *(fdb_kvs_handle **)(auStack_2e28 + doc._M_i * 8 + 8);
        pfVar28 = (fdb_kvs_handle *)pfVar10->staletree;
        pfStack_2e58 = (fdb_kvs_handle *)0x10ef77;
        iVar5 = bcmp(pbVar8,pfVar28,(size_t)(pfStack_2e40->kvs_config).custom_cmp);
        if (iVar5 == 0) {
          pbVar8 = (pfVar27->field_6).seqtree;
          pfVar28 = (fdb_kvs_handle *)(pfVar10->field_6).seqtree;
          pfStack_2e58 = (fdb_kvs_handle *)0x10ef96;
          iVar5 = bcmp(pbVar8,pfVar28,(size_t)(pfVar27->kvs_config).custom_cmp_param);
          if (iVar5 == 0) goto LAB_0010ef9e;
          pfStack_2e58 = (fdb_kvs_handle *)0x10f063;
          auto_recover_compact_ok_test();
          pfVar14 = pfVar27;
          goto LAB_0010f063;
        }
      }
      else {
LAB_0010f063:
        pfVar27 = pfVar14;
        pfStack_2e58 = (fdb_kvs_handle *)0x10f068;
        auto_recover_compact_ok_test();
      }
      pfStack_2e58 = (fdb_kvs_handle *)0x10f073;
      auto_recover_compact_ok_test();
      pfVar14 = pfVar27;
LAB_0010f073:
      pfStack_2e58 = (fdb_kvs_handle *)0x10f078;
      auto_recover_compact_ok_test();
      goto LAB_0010f078;
    }
  }
  else {
LAB_0010f078:
    pfStack_2e58 = (fdb_kvs_handle *)0x10f07d;
    auto_recover_compact_ok_test();
LAB_0010f07d:
    pfStack_2e58 = (fdb_kvs_handle *)0x10f082;
    auto_recover_compact_ok_test();
  }
  pfStack_2e58 = (fdb_kvs_handle *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_33c0 = (fdb_kvs_handle *)0x10f0a7;
  ppfStack_2e80 = ppfVar19;
  pfStack_2e78 = pfVar28;
  pfStack_2e70 = (fdb_kvs_handle *)doc._M_i;
  pfStack_2e68 = pfVar14;
  pbStack_2e60 = pbVar8;
  pfStack_2e58 = pfVar10;
  gettimeofday(&tStack_3330,(__timezone_ptr_t)0x0);
  pfStack_33c0 = (fdb_kvs_handle *)0x10f0ac;
  memleak_start();
  pfStack_33c0 = (fdb_kvs_handle *)0x10f0b8;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_33c0 = (fdb_kvs_handle *)0x10f0c8;
  fdb_get_default_config();
  pfVar14 = (fdb_kvs_handle *)auStack_3320;
  pfStack_33c0 = (fdb_kvs_handle *)0x10f0d8;
  fdb_get_default_kvs_config();
  fStack_2f78.buffercache_size = 0x1000000;
  fStack_2f78.wal_threshold = 0x400;
  fStack_2f78.flags = 1;
  fStack_2f78.compaction_threshold = '\0';
  ppfVar35 = &pfStack_3398;
  pfStack_33c0 = (fdb_kvs_handle *)0x10f10a;
  fdb_open((fdb_file_handle **)ppfVar35,"./compact_test1",&fStack_2f78);
  ptr_handle = (list *)(auStack_33a8 + 8);
  pfStack_33c0 = (fdb_kvs_handle *)0x10f11d;
  fdb_kvs_open_default
            ((fdb_file_handle *)pfStack_3398,(fdb_kvs_handle **)ptr_handle,(fdb_kvs_config *)pfVar14
            );
  pfStack_33c0 = (fdb_kvs_handle *)0x10f133;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_33a8._8_8_,logCallbackFunc,
                     "unlink_after_compaction_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar28 = (fdb_kvs_handle *)0x0;
    uVar16 = 0;
    do {
      pfStack_33c0 = (fdb_kvs_handle *)0x10f15b;
      sprintf(acStack_3108,"key%d",uVar16 & 0xffffffff);
      pfStack_33c0 = (fdb_kvs_handle *)0x10f173;
      sprintf(auStack_3320 + 0x118,"meta%d",uVar16 & 0xffffffff);
      pfStack_33c0 = (fdb_kvs_handle *)0x10f18b;
      sprintf(auStack_3320 + 0x18,"body%d",uVar16 & 0xffffffff);
      ppfVar35 = (fdb_doc **)((long)apfStack_3388 + (long)pfVar28);
      pfStack_33c0 = (fdb_kvs_handle *)0x10f19b;
      doc._M_i = strlen(acStack_3108);
      pfVar10 = (fdb_kvs_handle *)(auStack_3320 + 0x118);
      pfStack_33c0 = (fdb_kvs_handle *)0x10f1ae;
      pfVar14 = (fdb_kvs_handle *)strlen((char *)pfVar10);
      pfStack_33c0 = (fdb_kvs_handle *)0x10f1be;
      sVar6 = strlen(auStack_3320 + 0x18);
      pfStack_33c0 = (fdb_kvs_handle *)0x10f1e3;
      fdb_doc_create(ppfVar35,acStack_3108,doc._M_i,pfVar10,(size_t)pfVar14,auStack_3320 + 0x18,
                     sVar6);
      pfStack_33c0 = (fdb_kvs_handle *)0x10f1f2;
      fdb_set((fdb_kvs_handle *)auStack_33a8._8_8_,apfStack_3388[uVar16]);
      uVar16 = uVar16 + 1;
      pfVar28 = (fdb_kvs_handle *)((long)pfVar28 + 8);
    } while (uVar16 != 10);
    pfStack_33c0 = (fdb_kvs_handle *)0x10f212;
    fdb_commit((fdb_file_handle *)pfStack_3398,'\x01');
    pfStack_33c0 = (fdb_kvs_handle *)0x10f226;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_33a8._8_8_,&pfStack_3390,10);
    ptr_handle = (list *)0xa;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f38b;
    pfStack_33c0 = (fdb_kvs_handle *)0x10f23f;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_3398,"./compact_test2");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfVar14 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_33c0 = (fdb_kvs_handle *)0x10f273;
        fdb_doc_create((fdb_doc **)auStack_33a8,apfStack_3388[(long)pfVar14]->key,
                       apfStack_3388[(long)pfVar14]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_33c0 = (fdb_kvs_handle *)0x10f282;
        fVar4 = fdb_get((fdb_kvs_handle *)auStack_33a8._8_8_,(fdb_doc *)auStack_33a8._0_8_);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          pfStack_33c0 = (fdb_kvs_handle *)0x10f381;
          unlink_after_compaction_test();
          goto LAB_0010f381;
        }
        pfStack_33c0 = (fdb_kvs_handle *)0x10f294;
        fdb_doc_free((fdb_doc *)auStack_33a8._0_8_);
        pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x1;
      } while (pfVar14 != (fdb_kvs_handle *)0xa);
      pfStack_33c0 = (fdb_kvs_handle *)0x10f2b1;
      iVar5 = stat("./compact_test1",&sStack_3008);
      if (iVar5 == 0) {
        pfStack_33c0 = (fdb_kvs_handle *)0x10f2ba;
        unlink_after_compaction_test();
      }
      pfVar14 = (fdb_kvs_handle *)0x0;
      while( true ) {
        pfStack_33c0 = (fdb_kvs_handle *)0x10f2e6;
        fdb_doc_create((fdb_doc **)auStack_33a8,apfStack_3388[(long)pfVar14]->key,
                       apfStack_3388[(long)pfVar14]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_33c0 = (fdb_kvs_handle *)0x10f2f5;
        fVar4 = fdb_get(pfStack_3390,(fdb_doc *)auStack_33a8._0_8_);
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        pfStack_33c0 = (fdb_kvs_handle *)0x10f307;
        fdb_doc_free((fdb_doc *)auStack_33a8._0_8_);
        pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x1;
        if (pfVar14 == (fdb_kvs_handle *)0xa) {
          pfStack_33c0 = (fdb_kvs_handle *)0x10f31a;
          fdb_close((fdb_file_handle *)pfStack_3398);
          pfStack_33c0 = (fdb_kvs_handle *)0x10f31f;
          fdb_shutdown();
          lVar17 = 0;
          do {
            pfStack_33c0 = (fdb_kvs_handle *)0x10f32b;
            fdb_doc_free(apfStack_3388[lVar17]);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 10);
          pfStack_33c0 = (fdb_kvs_handle *)0x10f339;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_33c0 = (fdb_kvs_handle *)0x10f36a;
          fprintf(_stderr,pcVar23,"unlink after compaction test");
          return;
        }
      }
LAB_0010f381:
      ptr_handle = (list *)auStack_33a8;
      pfStack_33c0 = (fdb_kvs_handle *)0x10f386;
      unlink_after_compaction_test();
      goto LAB_0010f386;
    }
  }
  else {
LAB_0010f386:
    pfStack_33c0 = (fdb_kvs_handle *)0x10f38b;
    unlink_after_compaction_test();
LAB_0010f38b:
    pfStack_33c0 = (fdb_kvs_handle *)0x10f390;
    unlink_after_compaction_test();
  }
  pfStack_33c0 = (fdb_kvs_handle *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_3b68 = (fdb_kvs_handle *)0x10f3b5;
  fStack_35d0.bub_ctx.entries = ptr_handle;
  fStack_35d0.bub_ctx.num_entries = (uint64_t)pfVar28;
  fStack_35d0.bub_ctx.space_used = doc._M_i;
  fStack_35d0.bub_ctx.handle = pfVar14;
  ppfStack_33c8 = ppfVar35;
  pfStack_33c0 = pfVar10;
  gettimeofday(&tStack_3ad0,(__timezone_ptr_t)0x0);
  pfStack_3b68 = (fdb_kvs_handle *)0x10f3ba;
  memleak_start();
  pfStack_3b68 = (fdb_kvs_handle *)0x10f3c6;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_3b68 = (fdb_kvs_handle *)0x10f3d6;
  fdb_get_default_config();
  kvs_config_00 = &fStack_3b18;
  pfStack_3b68 = (fdb_kvs_handle *)0x10f3e3;
  fdb_get_default_kvs_config();
  auStack_39c0._256_8_ = 0x1000000;
  auStack_39c0._264_8_ = 0x400;
  auStack_39c0._284_4_ = 1;
  auStack_39c0[0x127] = 0;
  pfVar14 = (fdb_kvs_handle *)(auStack_3b40 + 0x18);
  pfStack_3b68 = (fdb_kvs_handle *)0x10f415;
  fdb_open((fdb_file_handle **)pfVar14,"./compact_test1",(fdb_config *)(auStack_39c0 + 0xf8));
  ppfVar19 = (fdb_kvs_handle **)(auStack_3b40 + 8);
  pfStack_3b68 = (fdb_kvs_handle *)0x10f42a;
  fdb_kvs_open((fdb_file_handle *)auStack_3b40._24_8_,ppfVar19,(char *)0x0,kvs_config_00);
  pfStack_3b68 = (fdb_kvs_handle *)0x10f440;
  pfVar27 = (fdb_kvs_handle *)auStack_3b40._8_8_;
  fVar4 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_3b40._8_8_,logCallbackFunc,"db_destroy_test");
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar28 = (fdb_kvs_handle *)0x0;
    uVar16 = 0;
    do {
      pfStack_3b68 = (fdb_kvs_handle *)0x10f468;
      sprintf(acStack_36d0,"key%d",uVar16 & 0xffffffff);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f480;
      sprintf(auStack_39c0 + 0x1f0,"meta%d",uVar16 & 0xffffffff);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f498;
      sprintf(acStack_3ac0,"body%d",uVar16 & 0xffffffff);
      pfVar14 = (fdb_kvs_handle *)(auStack_39c0 + (long)pfVar28);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f4ab;
      doc._M_i = strlen(acStack_36d0);
      pfVar10 = (fdb_kvs_handle *)(auStack_39c0 + 0x1f0);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f4be;
      kvs_config_00 = (fdb_kvs_config *)strlen((char *)pfVar10);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f4ce;
      sVar6 = strlen(acStack_3ac0);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f4f3;
      fdb_doc_create((fdb_doc **)pfVar14,acStack_36d0,doc._M_i,pfVar10,(size_t)kvs_config_00,
                     acStack_3ac0,sVar6);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f505;
      fdb_set((fdb_kvs_handle *)auStack_3b40._8_8_,*(fdb_doc **)(auStack_39c0 + uVar16 * 8));
      uVar16 = uVar16 + 1;
      pfVar28 = (fdb_kvs_handle *)((long)pfVar28 + 8);
    } while (uVar16 != 0x1e);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f522;
    fdb_commit((fdb_file_handle *)auStack_3b40._24_8_,'\0');
    pfStack_3b68 = (fdb_kvs_handle *)0x10f53e;
    fdb_open((fdb_file_handle **)(auStack_3b40 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_39c0 + 0xf8));
    ppfVar19 = (fdb_kvs_handle **)auStack_3b50;
    pfStack_3b68 = (fdb_kvs_handle *)0x10f555;
    fdb_kvs_open((fdb_file_handle *)auStack_3b40._16_8_,ppfVar19,(char *)0x0,&fStack_3b18);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f56b;
    pfVar27 = (fdb_kvs_handle *)auStack_3b50._0_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_3b50._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f9da;
    pfVar28 = (fdb_kvs_handle *)0x0;
    uVar16 = 0;
    do {
      pfStack_3b68 = (fdb_kvs_handle *)0x10f593;
      sprintf(acStack_36d0,"k2ey%d",uVar16 & 0xffffffff);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f5ab;
      sprintf(auStack_39c0 + 0x1f0,"m2eta%d",uVar16 & 0xffffffff);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f5c3;
      sprintf(acStack_3ac0,"b2ody%d",uVar16 & 0xffffffff);
      pfVar14 = (fdb_kvs_handle *)(&fStack_35d0.kvs_config.create_if_missing + (long)pfVar28);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f5d6;
      doc._M_i = strlen(acStack_36d0);
      pfVar10 = (fdb_kvs_handle *)(auStack_39c0 + 0x1f0);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f5e9;
      kvs_config_00 = (fdb_kvs_config *)strlen((char *)pfVar10);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f5f9;
      sVar6 = strlen(acStack_3ac0);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f61e;
      fdb_doc_create((fdb_doc **)pfVar14,acStack_36d0,doc._M_i,pfVar10,(size_t)kvs_config_00,
                     acStack_3ac0,sVar6);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f630;
      fdb_set((fdb_kvs_handle *)auStack_3b50._0_8_,
              *(fdb_doc **)(&fStack_35d0.kvs_config.create_if_missing + uVar16 * 8));
      uVar16 = uVar16 + 1;
      pfVar28 = (fdb_kvs_handle *)((long)pfVar28 + 8);
    } while (uVar16 != 0x3c);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f64d;
    fdb_commit((fdb_file_handle *)auStack_3b40._16_8_,'\0');
    pfStack_3b68 = (fdb_kvs_handle *)0x10f65c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_3b50._0_8_,&fStack_3b00);
    if ((filemgr *)fStack_3b00.last_seqnum != (filemgr *)0x3c) {
      pfStack_3b68 = (fdb_kvs_handle *)0x10f66c;
      db_compact_overwrite();
    }
    pfStack_3b68 = (fdb_kvs_handle *)0x10f676;
    fdb_kvs_close((fdb_kvs_handle *)auStack_3b50._0_8_);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f680;
    fdb_close((fdb_file_handle *)auStack_3b40._16_8_);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f68c;
    pfVar27 = (fdb_kvs_handle *)auStack_3b40._24_8_;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_3b40._24_8_,(char *)0x0);
    ppfVar19 = (fdb_kvs_handle **)0x3c;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f9df;
    kvs_config_00 = (fdb_kvs_config *)(auStack_3b40 + 8);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f6a1;
    fdb_kvs_close((fdb_kvs_handle *)auStack_3b40._8_8_);
    pfVar14 = (fdb_kvs_handle *)(auStack_3b40 + 0x18);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f6ae;
    fdb_close((fdb_file_handle *)auStack_3b40._24_8_);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f6c5;
    fdb_open((fdb_file_handle **)pfVar14,"./compact_test1",(fdb_config *)(auStack_39c0 + 0xf8));
    pfStack_3b68 = (fdb_kvs_handle *)0x10f6d7;
    fdb_kvs_open((fdb_file_handle *)auStack_3b40._24_8_,(fdb_kvs_handle **)kvs_config_00,(char *)0x0
                 ,&fStack_3b18);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f6ed;
    pfVar27 = (fdb_kvs_handle *)auStack_3b40._8_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_3b40._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010f9e4;
    ppfVar19 = (fdb_kvs_handle **)0x0;
    kvs_config_00 = (fdb_kvs_config *)(auStack_3b50 + 8);
    pfVar14 = (fdb_kvs_handle *)auStack_3b40;
    do {
      pfStack_3b68 = (fdb_kvs_handle *)0x10f728;
      fdb_doc_create((fdb_doc **)kvs_config_00,
                     (void *)(*(size_t **)(auStack_39c0 + (long)ppfVar19))[4],
                     **(size_t **)(auStack_39c0 + (long)ppfVar19),(void *)0x0,0,(void *)0x0,0);
      pfStack_3b68 = (fdb_kvs_handle *)0x10f737;
      pfVar27 = (fdb_kvs_handle *)auStack_3b40._8_8_;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_3b40._8_8_,(fdb_doc *)auStack_3b50._8_8_);
      pfVar22 = (fdb_kvs_handle *)auStack_3b50._8_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_3b68 = (fdb_kvs_handle *)0x10f9d0;
        db_compact_overwrite();
        goto LAB_0010f9d0;
      }
      doc._M_i = (__int_type_conflict)(auStack_39c0 + (long)ppfVar19);
      pfVar28 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)doc._M_i)->kvs_config;
      pfStack_3b68 = (fdb_kvs_handle *)0x10f765;
      iVar5 = bcmp(*(btree **)(auStack_3b50._8_8_ + 0x38),pfVar28->staletree,
                   (size_t)((fdb_kvs_config *)auStack_3b50._8_8_)->custom_cmp);
      if (iVar5 != 0) {
        pfStack_3b68 = (fdb_kvs_handle *)0x10f7ad;
        db_compact_overwrite();
        pfVar22 = pfStack_3b20;
        pfVar28 = (fdb_kvs_handle *)auStack_3b40._0_8_;
      }
      pfStack_3b68 = (fdb_kvs_handle *)0x10f77b;
      iVar5 = bcmp((pfVar22->field_6).seqtree,(pfVar28->field_6).seqtree,
                   (size_t)(pfVar22->kvs_config).custom_cmp_param);
      pfVar10 = pfVar22;
      if (iVar5 != 0) {
        pfStack_3b68 = (fdb_kvs_handle *)0x10f7c7;
        db_compact_overwrite();
        pfVar10 = (fdb_kvs_handle *)auStack_3b40._0_8_;
      }
      pfStack_3b68 = (fdb_kvs_handle *)0x10f787;
      fdb_doc_free((fdb_doc *)pfVar10);
      ppfVar19 = ppfVar19 + 1;
    } while (ppfVar19 != (fdb_kvs_handle **)0xf0);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f7ea;
    fdb_open((fdb_file_handle **)(auStack_3b40 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_39c0 + 0xf8));
    kvs_config_00 = (fdb_kvs_config *)auStack_3b50;
    pfStack_3b68 = (fdb_kvs_handle *)0x10f801;
    fdb_kvs_open((fdb_file_handle *)auStack_3b40._16_8_,(fdb_kvs_handle **)kvs_config_00,(char *)0x0
                 ,&fStack_3b18);
    pfStack_3b68 = (fdb_kvs_handle *)0x10f817;
    pfVar27 = (fdb_kvs_handle *)auStack_3b50._0_8_;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_3b50._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_3b68 = (fdb_kvs_handle *)0x10f831;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_3b50._0_8_,&fStack_3b00);
      if ((filemgr *)fStack_3b00.last_seqnum != (filemgr *)0x3c) {
        pfStack_3b68 = (fdb_kvs_handle *)0x10f842;
        db_compact_overwrite();
      }
      pfVar10 = (fdb_kvs_handle *)0x0;
      ppfVar19 = (fdb_kvs_handle **)(auStack_3b50 + 8);
      kvs_config_00 = (fdb_kvs_config *)auStack_3b40;
      while( true ) {
        psVar3 = *(size_t **)
                  (&fStack_35d0.kvs_config.create_if_missing +
                  (long)&(pfVar10->kvs_config).create_if_missing);
        pfStack_3b68 = (fdb_kvs_handle *)0x10f875;
        fdb_doc_create((fdb_doc **)ppfVar19,(void *)psVar3[4],*psVar3,(void *)0x0,0,(void *)0x0,0);
        pfStack_3b68 = (fdb_kvs_handle *)0x10f884;
        pfVar27 = (fdb_kvs_handle *)auStack_3b50._0_8_;
        fVar4 = fdb_get((fdb_kvs_handle *)auStack_3b50._0_8_,(fdb_doc *)auStack_3b50._8_8_);
        pfVar22 = (fdb_kvs_handle *)auStack_3b50._8_8_;
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        pfVar28 = (fdb_kvs_handle *)
                  (&fStack_35d0.kvs_config.create_if_missing +
                  (long)&(pfVar10->kvs_config).create_if_missing);
        pfVar14 = *(fdb_kvs_handle **)&pfVar28->kvs_config;
        pfStack_3b68 = (fdb_kvs_handle *)0x10f8b1;
        iVar5 = bcmp(*(btree **)(auStack_3b50._8_8_ + 0x38),pfVar14->staletree,
                     (size_t)((fdb_kvs_config *)auStack_3b50._8_8_)->custom_cmp);
        if (iVar5 != 0) {
          pfStack_3b68 = (fdb_kvs_handle *)0x10f8f8;
          db_compact_overwrite();
          pfVar22 = pfStack_3b20;
          pfVar14 = (fdb_kvs_handle *)auStack_3b40._0_8_;
        }
        pfStack_3b68 = (fdb_kvs_handle *)0x10f8c6;
        iVar5 = bcmp((pfVar22->field_6).seqtree,(pfVar14->field_6).seqtree,
                     (size_t)(pfVar22->kvs_config).custom_cmp_param);
        doc._M_i = (__int_type_conflict)pfVar22;
        if (iVar5 != 0) {
          pfStack_3b68 = (fdb_kvs_handle *)0x10f912;
          db_compact_overwrite();
          doc._M_i = auStack_3b40._0_8_;
        }
        pfStack_3b68 = (fdb_kvs_handle *)0x10f8d2;
        fdb_doc_free((fdb_doc *)doc._M_i);
        pfVar10 = (fdb_kvs_handle *)&(pfVar10->kvs_config).custom_cmp;
        if (pfVar10 == (fdb_kvs_handle *)0x1e0) {
          lVar17 = 0;
          do {
            pfStack_3b68 = (fdb_kvs_handle *)0x10f928;
            fdb_doc_free(*(fdb_doc **)(auStack_39c0 + lVar17 * 8));
            pfStack_3b68 = (fdb_kvs_handle *)0x10f935;
            fdb_doc_free(*(fdb_doc **)(&fStack_35d0.kvs_config.create_if_missing + lVar17 * 8));
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0x1e);
          lVar17 = 0;
          do {
            pfStack_3b68 = (fdb_kvs_handle *)0x10f94d;
            fdb_doc_free(*(fdb_doc **)(fStack_35d0.config.encryption_key.bytes + lVar17 * 8 + -0x14)
                        );
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0x1e);
          pfStack_3b68 = (fdb_kvs_handle *)0x10f960;
          fdb_kvs_close((fdb_kvs_handle *)auStack_3b40._8_8_);
          pfStack_3b68 = (fdb_kvs_handle *)0x10f96a;
          fdb_close((fdb_file_handle *)auStack_3b40._24_8_);
          pfStack_3b68 = (fdb_kvs_handle *)0x10f974;
          fdb_kvs_close((fdb_kvs_handle *)auStack_3b50._0_8_);
          pfStack_3b68 = (fdb_kvs_handle *)0x10f97e;
          fdb_close((fdb_file_handle *)auStack_3b40._16_8_);
          pfStack_3b68 = (fdb_kvs_handle *)0x10f983;
          fdb_shutdown();
          pfStack_3b68 = (fdb_kvs_handle *)0x10f988;
          memleak_end();
          pcVar23 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar23 = "%s FAILED\n";
          }
          pfStack_3b68 = (fdb_kvs_handle *)0x10f9b9;
          fprintf(_stderr,pcVar23,"compact overwrite");
          return;
        }
      }
LAB_0010f9d0:
      pfStack_3b68 = (fdb_kvs_handle *)0x10f9d5;
      db_compact_overwrite();
      goto LAB_0010f9d5;
    }
  }
  else {
LAB_0010f9d5:
    pfStack_3b68 = (fdb_kvs_handle *)0x10f9da;
    db_compact_overwrite();
LAB_0010f9da:
    pfStack_3b68 = (fdb_kvs_handle *)0x10f9df;
    db_compact_overwrite();
LAB_0010f9df:
    pfStack_3b68 = (fdb_kvs_handle *)0x10f9e4;
    db_compact_overwrite();
LAB_0010f9e4:
    pfStack_3b68 = (fdb_kvs_handle *)0x10f9e9;
    db_compact_overwrite();
  }
  pfStack_3b68 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  ppfStack_3b90 = ppfVar19;
  pfStack_3b88 = pfVar28;
  pfStack_3b80 = (fdb_kvs_handle *)doc._M_i;
  pfStack_3b78 = kvs_config_00;
  pfStack_3b70 = pfVar14;
  pfStack_3b68 = pfVar10;
  gettimeofday(&tStack_42c0,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStack_42b0.buffercache_size = 0;
  fStack_42b0.wal_threshold = 0x400;
  fStack_42b0.compaction_threshold = '\0';
  if (pfVar27 == (fdb_kvs_handle *)0x0) {
    system("rm -rf  compact_test* > errorlog.txt");
    _Var29._M_i = (__int_type_conflict)&pfStack_4328;
    fVar4 = fdb_open((fdb_file_handle **)_Var29._M_i,"./compact_test1",&fStack_42b0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      _Var29._M_i = (__int_type_conflict)pfStack_4328;
      fVar4 = fdb_kvs_open_default((fdb_file_handle *)pfStack_4328,&pfStack_4320,&fStack_4308);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fd42;
      lVar17 = 0;
      uVar16 = 0;
      do {
        pfVar1 = &afStack_40b8[0].config.encryption_key;
        sprintf((char *)pfVar1,"key%d",uVar16 & 0xffffffff);
        sprintf((char *)afStack_40b8,"meta%d",uVar16 & 0xffffffff);
        sprintf(acStack_41b8,"body%d",uVar16 & 0xffffffff);
        doc._M_i = strlen((char *)pfVar1);
        pfVar10 = afStack_40b8;
        sVar6 = strlen((char *)pfVar10);
        sVar7 = strlen(acStack_41b8);
        fdb_doc_create((fdb_doc **)((long)&afStack_40b8[0].bub_ctx.handle + lVar17),
                       &afStack_40b8[0].config.encryption_key,doc._M_i,pfVar10,sVar6,acStack_41b8,
                       sVar7);
        fdb_set(pfStack_4320,(fdb_doc *)(&afStack_40b8[0].bub_ctx.handle)[uVar16]);
        uVar16 = uVar16 + 1;
        lVar17 = lVar17 + 8;
      } while (uVar16 != 100);
      fdb_commit((fdb_file_handle *)pfStack_4328,'\0');
      fdb_get_kvs_info(pfStack_4320,&fStack_42f0);
      if ((filemgr *)fStack_42f0.doc_count != (filemgr *)0x64) {
        db_compact_during_doc_delete();
      }
      lVar17 = 0;
      pfVar14 = (fdb_kvs_handle *)&plStack_4318;
      do {
        fdb_del(pfStack_4320,(fdb_doc *)(&afStack_40b8[0].bub_ctx.handle)[lVar17]);
        if (lVar17 == 0x32) {
          pthread_create((pthread_t *)pfVar14,(pthread_attr_t *)0x0,db_compact_during_doc_delete,
                         pfStack_4328);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 100);
      pthread_join((pthread_t)plStack_4318,&pvStack_4310);
      fdb_commit((fdb_file_handle *)pfStack_4328,'\x01');
      fdb_get_kvs_info(pfStack_4320,&fStack_42f0);
      if ((filemgr *)fStack_42f0.doc_count != (filemgr *)0x0) {
        db_compact_during_doc_delete();
      }
      fdb_kvs_close(pfStack_4320);
      _Var29._M_i = (__int_type_conflict)&pfStack_4328;
      fdb_close((fdb_file_handle *)pfStack_4328);
      fVar4 = fdb_open((fdb_file_handle **)_Var29._M_i,"./compact_test1",&fStack_42b0);
      pfVar28 = (fdb_kvs_handle *)0x64;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fd47;
      _Var29._M_i = (__int_type_conflict)pfStack_4328;
      fVar4 = fdb_kvs_open_default((fdb_file_handle *)pfStack_4328,&pfStack_4320,&fStack_4308);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        fdb_get_kvs_info(pfStack_4320,&fStack_42f0);
        if ((filemgr *)fStack_42f0.doc_count != (filemgr *)0x0) {
          db_compact_during_doc_delete();
        }
        lVar17 = 0;
        do {
          fdb_doc_free((fdb_doc *)(&afStack_40b8[0].bub_ctx.handle)[lVar17]);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 100);
        fdb_kvs_close(pfStack_4320);
        fdb_close((fdb_file_handle *)pfStack_4328);
        fdb_shutdown();
        memleak_end();
        pcVar23 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar23,"multi thread client shutdown");
        return;
      }
    }
    else {
      db_compact_during_doc_delete();
LAB_0010fd42:
      db_compact_during_doc_delete();
LAB_0010fd47:
      db_compact_during_doc_delete();
    }
    db_compact_during_doc_delete();
LAB_0010fd51:
    db_compact_during_doc_delete();
  }
  else {
    _Var29._M_i = (__int_type_conflict)&pfStack_4328;
    fVar4 = fdb_open((fdb_file_handle **)_Var29._M_i,"./compact_test1",&fStack_42b0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0010fd51;
    _Var29._M_i = (__int_type_conflict)pfStack_4328;
    fVar4 = fdb_compact((fdb_file_handle *)pfStack_4328,(char *)0x0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      fdb_close((fdb_file_handle *)pfStack_4328);
      pthread_exit((void *)0x0);
    }
  }
  db_compact_during_doc_delete();
  ptr_fhandle = (filemgr *)0x0;
  pfStack_180e8 = (fdb_kvs_handle *)0x10fd83;
  auStack_180b0._8_8_ = _Var29._M_i;
  gettimeofday(&tStack_17f48,(__timezone_ptr_t)0x0);
  pfStack_180e8 = (fdb_kvs_handle *)0x10fd88;
  memleak_start();
  pfStack_180e8 = (fdb_kvs_handle *)0x10fd94;
  system("rm -rf  compact_test* > errorlog.txt");
  pcVar23 = auStack_18050;
  pfStack_180e8 = (fdb_kvs_handle *)0x10fda4;
  fdb_get_default_config();
  pfStack_180e8 = (fdb_kvs_handle *)0x10fdae;
  fdb_get_default_kvs_config();
  auStack_18050._8_8_ = 0;
  aStack_18040.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x400;
  fStack_1802c = 1;
  uStack_18022 = 0x1e01;
  pfStack_18018 = (filemgr *)0x1;
  aStack_17fd8.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  pcVar33 = auStack_180d8;
  pfStack_180e8 = (fdb_kvs_handle *)0x10fde7;
  fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test",(fdb_config *)pcVar23);
  if (fVar4 == FDB_RESULT_INVALID_CONFIG) {
    aStack_17fd8.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)4;
    pfStack_180e8 = (fdb_kvs_handle *)0x10fe14;
    fdb_open((fdb_file_handle **)auStack_180d8,"compact_test",(fdb_config *)auStack_18050);
    pcVar23 = auStack_180d0;
    pfStack_180e8 = (fdb_kvs_handle *)0x10fe29;
    fdb_kvs_open_default((fdb_file_handle *)auStack_180d8,(fdb_kvs_handle **)pcVar23,&fStack_180a0);
    pfStack_180e8 = (fdb_kvs_handle *)0x10fe3f;
    pcVar33 = (char *)auStack_180d0;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_180d0,logCallbackFunc,"compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108c8;
    pfStack_180e8 = (fdb_kvs_handle *)0x10fe53;
    puts("Initialize..");
    doc._M_i = 0;
    uVar16 = 0;
    do {
      pfStack_180e8 = (fdb_kvs_handle *)0x10fe75;
      sprintf(auStack_17f38 + 0x48,"key%04d",uVar16 & 0xffffffff);
      pfStack_180e8 = (fdb_kvs_handle *)0x10fe8e;
      sprintf(acStack_17cf0,"meta%04d",uVar16 & 0xffffffff);
      pfStack_180e8 = (fdb_kvs_handle *)0x10fea7;
      sprintf(acStack_17df0,"body%04d",uVar16 & 0xffffffff);
      pfVar28 = (fdb_kvs_handle *)(&afStack_17bf0[0].kvs_config.create_if_missing + doc._M_i);
      pfStack_180e8 = (fdb_kvs_handle *)0x10feba;
      sVar6 = strlen(auStack_17f38 + 0x48);
      pfVar10 = (fdb_kvs_handle *)(sVar6 + 1);
      pfStack_180e8 = (fdb_kvs_handle *)0x10fece;
      sVar6 = strlen(acStack_17cf0);
      pfVar14 = (fdb_kvs_handle *)(sVar6 + 1);
      pfStack_180e8 = (fdb_kvs_handle *)0x10fedf;
      sVar6 = strlen(acStack_17df0);
      pfStack_180e8 = (fdb_kvs_handle *)0x10ff07;
      fdb_doc_create((fdb_doc **)pfVar28,auStack_17f38 + 0x48,(size_t)pfVar10,acStack_17cf0,
                     (size_t)pfVar14,acStack_17df0,sVar6 + 1);
      pfStack_180e8 = (fdb_kvs_handle *)0x10ff19;
      fdb_set((fdb_kvs_handle *)auStack_180d0,
              *(fdb_doc **)(&afStack_17bf0[0].kvs_config.create_if_missing + uVar16 * 8));
      uVar16 = uVar16 + 1;
      doc._M_i = doc._M_i + 8;
    } while (uVar16 != 10000);
    pcVar23 = auStack_180d8;
    pfStack_180e8 = (fdb_kvs_handle *)0x10ff3c;
    fdb_commit((fdb_file_handle *)auStack_180d8,'\0');
    pfStack_180e8 = (fdb_kvs_handle *)0x10ff44;
    fdb_close((fdb_file_handle *)auStack_180d8);
    pfStack_180e8 = (fdb_kvs_handle *)0x10ff5b;
    pcVar33 = pcVar23;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test",(fdb_config *)auStack_18050);
    ptr_fhandle = (filemgr *)0x2710;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108cd;
    pfStack_180e8 = (fdb_kvs_handle *)0x10ff77;
    pcVar33 = (char *)auStack_180d8;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_180d8,(fdb_kvs_handle **)auStack_180d0,
                       &fStack_180a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108d2;
    pfStack_180e8 = (fdb_kvs_handle *)0x10ff97;
    pcVar33 = (char *)auStack_180d0;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_180d0,logCallbackFunc,"compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108d7;
    pcVar23 = auStack_17f38;
    pfStack_180e8 = (fdb_kvs_handle *)0x10ffb4;
    fdb_get_file_info((fdb_file_handle *)auStack_180d8,(fdb_file_info *)pcVar23);
    pfStack_180e8 = (fdb_kvs_handle *)0x10ffc3;
    iVar5 = strcmp((char *)auStack_17f38._0_8_,"compact_test");
    if (iVar5 != 0) {
      pfStack_180e8 = (fdb_kvs_handle *)0x10ffd4;
      compaction_daemon_test();
    }
    ptr_fhandle = (filemgr *)(auStack_17f38 + 0x48);
    pfVar14 = (fdb_kvs_handle *)auStack_180c0;
    pfVar28 = (fdb_kvs_handle *)0x0;
    _Var29._M_i = doc._M_i;
    do {
      pfStack_180e8 = (fdb_kvs_handle *)0x10fff8;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar28 & 0xffffffff);
      pfStack_180e8 = (fdb_kvs_handle *)0x110000;
      sVar6 = strlen((char *)ptr_fhandle);
      pfStack_180e8 = (fdb_kvs_handle *)0x11001f;
      fdb_doc_create((fdb_doc **)pfVar14,ptr_fhandle,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_180e8 = (fdb_kvs_handle *)0x11002e;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_180d0,(fdb_doc *)auStack_180c0._0_8_);
      doc._M_i = auStack_180c0._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011089e:
        pfStack_180e8 = (fdb_kvs_handle *)0x1108a3;
        compaction_daemon_test();
        goto LAB_001108a3;
      }
      pfVar10 = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_180c0._0_8_ + 0x40))->
                seqtree;
      pcVar23 = *(char **)(*(long *)(&afStack_17bf0[0].kvs_config.create_if_missing +
                                    (long)pfVar28 * 8) + 0x40);
      pfStack_180e8 = (fdb_kvs_handle *)0x11005a;
      iVar5 = bcmp(pfVar10,pcVar23,(size_t)*(void **)(auStack_180c0._0_8_ + 0x10));
      _Var29._M_i = doc._M_i;
      if (iVar5 != 0) {
        pfStack_180e8 = (fdb_kvs_handle *)0x11089e;
        compaction_daemon_test();
        goto LAB_0011089e;
      }
      pfStack_180e8 = (fdb_kvs_handle *)0x11006a;
      fdb_doc_free((fdb_doc *)doc._M_i);
      pfVar28 = (fdb_kvs_handle *)&(pfVar28->kvs_config).field_0x1;
    } while (pfVar28 != (fdb_kvs_handle *)0x2710);
    pfStack_180e8 = (fdb_kvs_handle *)0x11008e;
    pcVar33 = (char *)auStack_180d0;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_180d0,(fdb_kvs_handle **)&aStack_18088,10000
                             );
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108dc;
    pfStack_180e8 = (fdb_kvs_handle *)0x1100a0;
    fdb_kvs_close((fdb_kvs_handle *)aStack_18088.super___atomic_base<unsigned_long>._M_i);
    pcVar23 = auStack_180d8;
    pfStack_180e8 = (fdb_kvs_handle *)0x1100ad;
    fdb_close((fdb_file_handle *)auStack_180d8);
    pfStack_180e8 = (fdb_kvs_handle *)0x1100b9;
    system("rm -rf  compact_test.meta > errorlog.txt");
    pfStack_180e8 = (fdb_kvs_handle *)0x1100d0;
    pcVar33 = pcVar23;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108e1;
    pfStack_180e8 = (fdb_kvs_handle *)0x1100ec;
    pcVar33 = (char *)auStack_180d8;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_180d8,(fdb_kvs_handle **)auStack_180d0,
                       &fStack_180a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108e6;
    pfStack_180e8 = (fdb_kvs_handle *)0x11010c;
    pcVar33 = (char *)auStack_180d0;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_180d0,logCallbackFunc,"compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108eb;
    ptr_fhandle = (filemgr *)(auStack_17f38 + 0x48);
    pfVar14 = (fdb_kvs_handle *)auStack_180c0;
    pfVar28 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_180e8 = (fdb_kvs_handle *)0x110138;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar28 & 0xffffffff);
      pfStack_180e8 = (fdb_kvs_handle *)0x110140;
      sVar6 = strlen((char *)ptr_fhandle);
      pfStack_180e8 = (fdb_kvs_handle *)0x11015f;
      fdb_doc_create((fdb_doc **)pfVar14,ptr_fhandle,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_180e8 = (fdb_kvs_handle *)0x11016e;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_180d0,(fdb_doc *)auStack_180c0._0_8_);
      _Var29._M_i = auStack_180c0._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108ae;
      pfVar10 = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_180c0._0_8_ + 0x40))->
                seqtree;
      pcVar23 = *(char **)(*(long *)(&afStack_17bf0[0].kvs_config.create_if_missing +
                                    (long)pfVar28 * 8) + 0x40);
      pfStack_180e8 = (fdb_kvs_handle *)0x11019a;
      iVar5 = bcmp(pfVar10,pcVar23,(size_t)*(void **)(auStack_180c0._0_8_ + 0x10));
      if (iVar5 != 0) goto LAB_001108a3;
      pfStack_180e8 = (fdb_kvs_handle *)0x1101aa;
      fdb_doc_free((fdb_doc *)_Var29._M_i);
      pfVar28 = (fdb_kvs_handle *)&(pfVar28->kvs_config).field_0x1;
      doc._M_i = _Var29._M_i;
    } while (pfVar28 != (fdb_kvs_handle *)0x2710);
    pcVar23 = auStack_180d8;
    pfStack_180e8 = (fdb_kvs_handle *)0x1101c7;
    fdb_close((fdb_file_handle *)auStack_180d8);
    pfStack_180e8 = (fdb_kvs_handle *)0x1101d3;
    system("mv  compact_test.0 compact_test.23 > errorlog.txt");
    pfStack_180e8 = (fdb_kvs_handle *)0x1101ea;
    pcVar33 = pcVar23;
    fVar4 = fdb_open((fdb_file_handle **)pcVar23,"compact_test",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108f0;
    pfStack_180e8 = (fdb_kvs_handle *)0x110206;
    pcVar33 = (char *)auStack_180d8;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_180d8,(fdb_kvs_handle **)auStack_180d0,
                       &fStack_180a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108f5;
    pfStack_180e8 = (fdb_kvs_handle *)0x110226;
    pcVar33 = (char *)auStack_180d0;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_180d0,logCallbackFunc,"compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108fa;
    ptr_fhandle = (filemgr *)(auStack_17f38 + 0x48);
    pfVar14 = (fdb_kvs_handle *)auStack_180c0;
    pfVar28 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_180e8 = (fdb_kvs_handle *)0x110252;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar28 & 0xffffffff);
      pfStack_180e8 = (fdb_kvs_handle *)0x11025a;
      sVar6 = strlen((char *)ptr_fhandle);
      pfStack_180e8 = (fdb_kvs_handle *)0x110279;
      fdb_doc_create((fdb_doc **)pfVar14,ptr_fhandle,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_180e8 = (fdb_kvs_handle *)0x110288;
      pcVar33 = (char *)auStack_180d0;
      fVar4 = fdb_get((fdb_kvs_handle *)auStack_180d0,(fdb_doc *)auStack_180c0._0_8_);
      _Var29._M_i = auStack_180c0._0_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108be;
      pfVar10 = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_180c0._0_8_ + 0x40))->
                seqtree;
      pcVar23 = *(char **)(*(long *)(&afStack_17bf0[0].kvs_config.create_if_missing +
                                    (long)pfVar28 * 8) + 0x40);
      pfStack_180e8 = (fdb_kvs_handle *)0x1102b4;
      iVar5 = bcmp(pfVar10,pcVar23,(size_t)*(void **)(auStack_180c0._0_8_ + 0x10));
      if (iVar5 != 0) goto LAB_001108b3;
      pfStack_180e8 = (fdb_kvs_handle *)0x1102c4;
      fdb_doc_free((fdb_doc *)_Var29._M_i);
      pfVar28 = (fdb_kvs_handle *)&(pfVar28->kvs_config).field_0x1;
      doc._M_i = _Var29._M_i;
    } while (pfVar28 != (fdb_kvs_handle *)0x2710);
    pfStack_180e8 = (fdb_kvs_handle *)0x1102de;
    fdb_close((fdb_file_handle *)auStack_180d8);
    pcVar33 = auStack_180b0;
    pfStack_180e8 = (fdb_kvs_handle *)0x1102f7;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_less",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001108ff;
    pfStack_180e8 = (fdb_kvs_handle *)0x110313;
    pcVar33 = (char *)auStack_180b0._0_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_180b0._0_8_,
                       (fdb_kvs_handle **)&aStack_18070.seqtree,&fStack_180a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110904;
    uStack_18022 = uStack_18022 & 0xff;
    pcVar33 = auStack_180c0 + 8;
    pfStack_180e8 = (fdb_kvs_handle *)0x110338;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_non",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110909;
    pfStack_180e8 = (fdb_kvs_handle *)0x110354;
    pcVar33 = (char *)auStack_180c0._8_8_;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_180c0._8_8_,(fdb_kvs_handle **)&_Stack_18078,
                       &fStack_180a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011090e;
    uStack_18022 = uStack_18022 & 0xff00;
    pcVar33 = auStack_180c8;
    pfStack_180e8 = (fdb_kvs_handle *)0x110379;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_manual",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110913;
    pfStack_180e8 = (fdb_kvs_handle *)0x110395;
    pcVar33 = (char *)auStack_180c8;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_180c8,(fdb_kvs_handle **)&aStack_18080.seqtree,
                       &fStack_180a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110918;
    uStack_18022 = 0x1e01;
    pcVar33 = auStack_180d8;
    pfStack_180e8 = (fdb_kvs_handle *)0x1103bc;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011091d;
    pfStack_180e8 = (fdb_kvs_handle *)0x1103d8;
    pcVar33 = (char *)auStack_180d8;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_180d8,(fdb_kvs_handle **)auStack_180d0,
                       &fStack_180a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110922;
    pfStack_180e8 = (fdb_kvs_handle *)0x1103f8;
    pcVar33 = (char *)auStack_180d0;
    fVar4 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_180d0,logCallbackFunc,"compaction_daemon_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110927;
    _Var29._M_i = 0;
    pfStack_180e8 = (fdb_kvs_handle *)0x110416;
    printf("wait for %d seconds..\n");
    pcVar23 = auStack_17f58;
    pfStack_180e8 = (fdb_kvs_handle *)0x110428;
    gettimeofday((timeval *)pcVar23,(__timezone_ptr_t)0x0);
    tVar37.tv_usec = auStack_17f58._8_8_;
    tVar37.tv_sec = auStack_17f58._0_8_;
    pfVar28 = (fdb_kvs_handle *)auStack_18060;
    while( true ) {
      pfStack_180e8 = (fdb_kvs_handle *)0x110449;
      fdb_set((fdb_kvs_handle *)auStack_180d0,
              *(fdb_doc **)(&afStack_17bf0[0].kvs_config.create_if_missing + _Var29._M_i * 8));
      pfStack_180e8 = (fdb_kvs_handle *)0x110455;
      fdb_commit((fdb_file_handle *)auStack_180d8,'\0');
      if ((ushort)((ushort)((short)_Var29._M_i * 0x5c29) >> 2 | (short)_Var29._M_i * 0x4000) < 0x290
         ) {
        pfStack_180e8 = (fdb_kvs_handle *)0x11047c;
        fdb_set((fdb_kvs_handle *)aStack_18070.seqtree,
                *(fdb_doc **)(&afStack_17bf0[0].kvs_config.create_if_missing + _Var29._M_i * 8));
        pfStack_180e8 = (fdb_kvs_handle *)0x110488;
        fdb_commit((fdb_file_handle *)auStack_180b0._0_8_,'\0');
      }
      pfStack_180e8 = (fdb_kvs_handle *)0x11049a;
      fdb_set((fdb_kvs_handle *)_Stack_18078._M_i,
              *(fdb_doc **)(&afStack_17bf0[0].kvs_config.create_if_missing + _Var29._M_i * 8));
      pfStack_180e8 = (fdb_kvs_handle *)0x1104a6;
      fdb_commit((fdb_file_handle *)auStack_180c0._8_8_,'\0');
      pfStack_180e8 = (fdb_kvs_handle *)0x1104b8;
      fdb_set((fdb_kvs_handle *)aStack_18080.seqtree,
              *(fdb_doc **)(&afStack_17bf0[0].kvs_config.create_if_missing + _Var29._M_i * 8));
      pfStack_180e8 = (fdb_kvs_handle *)0x1104c4;
      fdb_commit((fdb_file_handle *)auStack_180c8,'\0');
      pfStack_180e8 = (fdb_kvs_handle *)0x1104ce;
      gettimeofday((timeval *)pfVar28,(__timezone_ptr_t)0x0);
      pfStack_180e8 = (fdb_kvs_handle *)0x1104e9;
      tVar36 = _utime_gap(tVar37,(timeval)auStack_18060);
      if ((ulong)auStack_180b0._8_8_ <= (fdb_kvs_handle *)tVar36.tv_sec) break;
      _Var29._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)_Var29._M_i)->kvs_config).field_0x1;
      if ((undefined1 *)_Var29._M_i == (undefined1 *)0x2710) {
        _Var29._M_i = 0;
      }
    }
    pfStack_180e8 = (fdb_kvs_handle *)0x110517;
    pcVar33 = (char *)auStack_180d8;
    fVar4 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_180d8,0x3c);
    ptr_fhandle = (filemgr *)auStack_17f58._0_8_;
    pfVar14 = (fdb_kvs_handle *)auStack_17f58._8_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011092c;
    pfStack_180e8 = (fdb_kvs_handle *)0x11052e;
    pcVar33 = (char *)auStack_180d8;
    fVar4 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_180d8,1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110931;
    pfStack_180e8 = (fdb_kvs_handle *)0x110542;
    pcVar33 = (char *)auStack_180c0._8_8_;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_180c0._8_8_,(char *)0x0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110936;
    pfStack_180e8 = (fdb_kvs_handle *)0x11055b;
    pcVar33 = (char *)auStack_180c8;
    fVar4 = fdb_compact((fdb_file_handle *)auStack_180c8,"compact_test_manual_compacted");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011093b;
    uStack_18022 = uStack_18022 & 0xff00;
    pcVar33 = auStack_18068;
    pfStack_180e8 = (fdb_kvs_handle *)0x110580;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110940;
    pfStack_180e8 = (fdb_kvs_handle *)0x11059c;
    pcVar33 = (char *)auStack_180c8;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_180c8,'\x01',0x1e);
    if (fVar4 != FDB_RESULT_FILE_IS_BUSY) goto LAB_00110945;
    pfStack_180e8 = (fdb_kvs_handle *)0x1105af;
    fVar4 = fdb_close((fdb_file_handle *)auStack_18068);
    pcVar33 = (char *)auStack_18068;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011094a;
    pfStack_180e8 = (fdb_kvs_handle *)0x1105cb;
    pcVar33 = (char *)auStack_180c8;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_180c8,'\x01',10);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011094f;
    pfStack_180e8 = (fdb_kvs_handle *)0x1105e7;
    pcVar33 = (char *)auStack_180c8;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_180c8,'\x01',0x1e);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110954;
    pfStack_180e8 = (fdb_kvs_handle *)0x1105f9;
    pcVar33 = (char *)auStack_180c8;
    fVar4 = fdb_close((fdb_file_handle *)auStack_180c8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110959;
    uStack_18022 = CONCAT11(uStack_18022._1_1_,1);
    pcVar33 = auStack_180c8;
    pfStack_180e8 = (fdb_kvs_handle *)0x11061e;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011095e;
    pfStack_180e8 = (fdb_kvs_handle *)0x110634;
    pcVar33 = (char *)auStack_180c0._8_8_;
    fVar4 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_180c0._8_8_,'\0',0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110963;
    pfStack_180e8 = (fdb_kvs_handle *)0x110646;
    pcVar33 = (char *)auStack_180c0._8_8_;
    fVar4 = fdb_close((fdb_file_handle *)auStack_180c0._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110968;
    uStack_18022 = uStack_18022 & 0xff00;
    pcVar33 = auStack_180c0 + 8;
    pfStack_180e8 = (fdb_kvs_handle *)0x11066b;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_non",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011096d;
    pcVar23 = "compact_test_non.manual";
    pfStack_180e8 = (fdb_kvs_handle *)0x110687;
    fdb_compact((fdb_file_handle *)auStack_180c0._8_8_,"compact_test_non.manual");
    ptr_fhandle = (filemgr *)auStack_180d8;
    pfStack_180e8 = (fdb_kvs_handle *)0x110694;
    fdb_close((fdb_file_handle *)auStack_180d8);
    pfStack_180e8 = (fdb_kvs_handle *)0x11069e;
    fdb_close((fdb_file_handle *)auStack_180b0._0_8_);
    pfStack_180e8 = (fdb_kvs_handle *)0x1106a8;
    fdb_close((fdb_file_handle *)auStack_180c8);
    uStack_18022 = CONCAT11(uStack_18022._1_1_,1);
    pfStack_180e8 = (fdb_kvs_handle *)0x1106bf;
    pcVar33 = (char *)ptr_fhandle;
    fVar4 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non.manual",
                     (fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110972;
    pcVar33 = "compact_test_non.manual";
    pfStack_180e8 = (fdb_kvs_handle *)0x1106dc;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110977;
    uStack_18022 = uStack_18022 & 0xff00;
    pcVar33 = auStack_180d8;
    pfStack_180e8 = (fdb_kvs_handle *)0x110702;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_0011097c;
    pcVar33 = "compact_test_manual_compacted";
    pfStack_180e8 = (fdb_kvs_handle *)0x11071f;
    fVar4 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110981;
    uStack_18022 = CONCAT11(uStack_18022._1_1_,1);
    pcVar33 = "compact_test_manual_compacted";
    pfStack_180e8 = (fdb_kvs_handle *)0x110740;
    fVar4 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110986;
    uStack_18022 = uStack_18022 & 0xff00;
    pcVar33 = "compact_test_non.manual";
    pfStack_180e8 = (fdb_kvs_handle *)0x110760;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011098b;
    pfStack_180e8 = (fdb_kvs_handle *)0x110773;
    fdb_close((fdb_file_handle *)auStack_180c0._8_8_);
    pfStack_180e8 = (fdb_kvs_handle *)0x110778;
    fVar4 = fdb_shutdown();
    pcVar33 = (char *)auStack_180c0._8_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110990;
    pcVar33 = "compact_test_non.manual";
    pfStack_180e8 = (fdb_kvs_handle *)0x110794;
    fVar4 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110995;
    fStack_1802c = 2;
    pcVar33 = auStack_180d8;
    pfStack_180e8 = (fdb_kvs_handle *)0x1107bc;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"./compact_test_manual_compacted",
                     (fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099a;
    pcVar33 = auStack_180d8;
    pfStack_180e8 = (fdb_kvs_handle *)0x1107de;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"./compact_test_manual_compacted.meta",
                     (fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099f;
    pcVar33 = auStack_180d8;
    pfStack_180e8 = (fdb_kvs_handle *)0x110800;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_non",(fdb_config *)auStack_18050);
    if (fVar4 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001109a4;
    pcVar33 = auStack_180d8;
    pfStack_180e8 = (fdb_kvs_handle *)0x110822;
    fVar4 = fdb_open((fdb_file_handle **)pcVar33,"compact_test_non.manual",
                     (fdb_config *)auStack_18050);
    if (fVar4 == FDB_RESULT_NO_SUCH_FILE) {
      lVar17 = 0;
      do {
        pfStack_180e8 = (fdb_kvs_handle *)0x11083a;
        fdb_doc_free(*(fdb_doc **)(&afStack_17bf0[0].kvs_config.create_if_missing + lVar17 * 8));
        lVar17 = lVar17 + 1;
      } while (lVar17 != 10000);
      pfStack_180e8 = (fdb_kvs_handle *)0x11084b;
      fdb_shutdown();
      pfStack_180e8 = (fdb_kvs_handle *)0x110850;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_180e8 = (fdb_kvs_handle *)0x110881;
      fprintf(_stderr,pcVar23,"compaction daemon test");
      return;
    }
  }
  else {
LAB_001108c3:
    pfStack_180e8 = (fdb_kvs_handle *)0x1108c8;
    compaction_daemon_test();
LAB_001108c8:
    pfStack_180e8 = (fdb_kvs_handle *)0x1108cd;
    compaction_daemon_test();
LAB_001108cd:
    pfStack_180e8 = (fdb_kvs_handle *)0x1108d2;
    compaction_daemon_test();
LAB_001108d2:
    pfStack_180e8 = (fdb_kvs_handle *)0x1108d7;
    compaction_daemon_test();
LAB_001108d7:
    pfStack_180e8 = (fdb_kvs_handle *)0x1108dc;
    compaction_daemon_test();
LAB_001108dc:
    pfStack_180e8 = (fdb_kvs_handle *)0x1108e1;
    compaction_daemon_test();
LAB_001108e1:
    pfStack_180e8 = (fdb_kvs_handle *)0x1108e6;
    compaction_daemon_test();
LAB_001108e6:
    pfStack_180e8 = (fdb_kvs_handle *)0x1108eb;
    compaction_daemon_test();
    _Var29._M_i = doc._M_i;
LAB_001108eb:
    pfStack_180e8 = (fdb_kvs_handle *)0x1108f0;
    compaction_daemon_test();
LAB_001108f0:
    pfStack_180e8 = (fdb_kvs_handle *)0x1108f5;
    compaction_daemon_test();
LAB_001108f5:
    pfStack_180e8 = (fdb_kvs_handle *)0x1108fa;
    compaction_daemon_test();
LAB_001108fa:
    pfStack_180e8 = (fdb_kvs_handle *)0x1108ff;
    compaction_daemon_test();
LAB_001108ff:
    pfStack_180e8 = (fdb_kvs_handle *)0x110904;
    compaction_daemon_test();
LAB_00110904:
    pfStack_180e8 = (fdb_kvs_handle *)0x110909;
    compaction_daemon_test();
LAB_00110909:
    pfStack_180e8 = (fdb_kvs_handle *)0x11090e;
    compaction_daemon_test();
LAB_0011090e:
    pfStack_180e8 = (fdb_kvs_handle *)0x110913;
    compaction_daemon_test();
LAB_00110913:
    pfStack_180e8 = (fdb_kvs_handle *)0x110918;
    compaction_daemon_test();
LAB_00110918:
    pfStack_180e8 = (fdb_kvs_handle *)0x11091d;
    compaction_daemon_test();
LAB_0011091d:
    pfStack_180e8 = (fdb_kvs_handle *)0x110922;
    compaction_daemon_test();
LAB_00110922:
    pfStack_180e8 = (fdb_kvs_handle *)0x110927;
    compaction_daemon_test();
LAB_00110927:
    pfStack_180e8 = (fdb_kvs_handle *)0x11092c;
    compaction_daemon_test();
LAB_0011092c:
    pfStack_180e8 = (fdb_kvs_handle *)0x110931;
    compaction_daemon_test();
LAB_00110931:
    pfStack_180e8 = (fdb_kvs_handle *)0x110936;
    compaction_daemon_test();
LAB_00110936:
    pfStack_180e8 = (fdb_kvs_handle *)0x11093b;
    compaction_daemon_test();
LAB_0011093b:
    pfStack_180e8 = (fdb_kvs_handle *)0x110940;
    compaction_daemon_test();
LAB_00110940:
    pfStack_180e8 = (fdb_kvs_handle *)0x110945;
    compaction_daemon_test();
LAB_00110945:
    pfStack_180e8 = (fdb_kvs_handle *)0x11094a;
    compaction_daemon_test();
LAB_0011094a:
    pfStack_180e8 = (fdb_kvs_handle *)0x11094f;
    compaction_daemon_test();
LAB_0011094f:
    pfStack_180e8 = (fdb_kvs_handle *)0x110954;
    compaction_daemon_test();
LAB_00110954:
    pfStack_180e8 = (fdb_kvs_handle *)0x110959;
    compaction_daemon_test();
LAB_00110959:
    pfStack_180e8 = (fdb_kvs_handle *)0x11095e;
    compaction_daemon_test();
LAB_0011095e:
    pfStack_180e8 = (fdb_kvs_handle *)0x110963;
    compaction_daemon_test();
LAB_00110963:
    pfStack_180e8 = (fdb_kvs_handle *)0x110968;
    compaction_daemon_test();
LAB_00110968:
    pfStack_180e8 = (fdb_kvs_handle *)0x11096d;
    compaction_daemon_test();
LAB_0011096d:
    pfStack_180e8 = (fdb_kvs_handle *)0x110972;
    compaction_daemon_test();
LAB_00110972:
    pfStack_180e8 = (fdb_kvs_handle *)0x110977;
    compaction_daemon_test();
LAB_00110977:
    pfStack_180e8 = (fdb_kvs_handle *)0x11097c;
    compaction_daemon_test();
LAB_0011097c:
    pfStack_180e8 = (fdb_kvs_handle *)0x110981;
    compaction_daemon_test();
LAB_00110981:
    pfStack_180e8 = (fdb_kvs_handle *)0x110986;
    compaction_daemon_test();
LAB_00110986:
    pfStack_180e8 = (fdb_kvs_handle *)0x11098b;
    compaction_daemon_test();
LAB_0011098b:
    pfStack_180e8 = (fdb_kvs_handle *)0x110990;
    compaction_daemon_test();
LAB_00110990:
    pfStack_180e8 = (fdb_kvs_handle *)0x110995;
    compaction_daemon_test();
LAB_00110995:
    pfStack_180e8 = (fdb_kvs_handle *)0x11099a;
    compaction_daemon_test();
LAB_0011099a:
    pfStack_180e8 = (fdb_kvs_handle *)0x11099f;
    compaction_daemon_test();
LAB_0011099f:
    pfStack_180e8 = (fdb_kvs_handle *)0x1109a4;
    compaction_daemon_test();
LAB_001109a4:
    pfStack_180e8 = (fdb_kvs_handle *)0x1109a9;
    compaction_daemon_test();
  }
  pfStack_180e8 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_18280 = (fdb_kvs_handle *)0x1109ce;
  pfStack_18110 = (filemgr *)pcVar23;
  pfStack_18108 = pfVar28;
  pfStack_18100 = (fdb_kvs_handle *)_Var29._M_i;
  pfStack_180f8 = ptr_fhandle;
  pfStack_180f0 = pfVar14;
  pfStack_180e8 = pfVar10;
  gettimeofday(&tStack_18230,(__timezone_ptr_t)0x0);
  pfStack_18280 = (fdb_kvs_handle *)0x1109d3;
  memleak_start();
  pfStack_18280 = (fdb_kvs_handle *)0x1109df;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_18280 = (fdb_kvs_handle *)0x1109ec;
  fdb_get_default_config();
  uStack_181da = 1;
  uStack_181d0._0_2_ = 1;
  uStack_181d0._2_2_ = 0;
  uStack_181d0._4_4_ = 0;
  pfStack_18280 = (fdb_kvs_handle *)0x110a0d;
  fVar4 = fdb_open(&pfStack_18270,"compact_test",(fdb_config *)(auStack_18220 + 0x18));
  pfVar30 = (fdb_config *)(auStack_18220 + 0x18);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfVar30 = (fdb_config *)auStack_18220;
    pfStack_18280 = (fdb_kvs_handle *)0x110a22;
    fdb_get_default_kvs_config();
    pfStack_18280 = (fdb_kvs_handle *)0x110a34;
    fVar4 = fdb_kvs_open_default(pfStack_18270,&pfStack_18268,(fdb_kvs_config *)pfVar30);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110b65;
    pfStack_18280 = (fdb_kvs_handle *)0x110a4b;
    gettimeofday(&tStack_18240,(__timezone_ptr_t)0x0);
    pfStack_18280 = (fdb_kvs_handle *)0x110a5b;
    printf("wait for %d seconds..\n",(ulong)pcVar33 & 0xffffffff);
    tVar36.tv_usec = tStack_18240.tv_usec;
    tVar36.tv_sec = tStack_18240.tv_sec;
    _Var29._M_i = (long)&atStack_18260[1].tv_sec + 1;
    pfVar10 = (fdb_kvs_handle *)0x0;
    do {
      iVar5 = (int)pfVar10;
      pfStack_18280 = (fdb_kvs_handle *)0x110a7c;
      sprintf((char *)_Var29._M_i,"%d",pfVar10);
      pfVar28 = pfStack_18268;
      pfStack_18280 = (fdb_kvs_handle *)0x110a89;
      sVar6 = strlen((char *)_Var29._M_i);
      pfStack_18280 = (fdb_kvs_handle *)0x110aa4;
      fVar4 = fdb_set_kv(pfVar28,(void *)_Var29._M_i,sVar6,"value",5);
      pfVar30 = (fdb_config *)tStack_18240.tv_sec;
      pfVar14 = (fdb_kvs_handle *)tStack_18240.tv_usec;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00110b5b:
        pfStack_18280 = (fdb_kvs_handle *)0x110b60;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b60;
      }
      pfStack_18280 = (fdb_kvs_handle *)0x110ab8;
      fVar4 = fdb_commit(pfStack_18270,'\0');
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_18280 = (fdb_kvs_handle *)0x110b5b;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b5b;
      }
      pfStack_18280 = (fdb_kvs_handle *)0x110acc;
      gettimeofday((timeval *)atStack_18260,(__timezone_ptr_t)0x0);
      pfStack_18280 = (fdb_kvs_handle *)0x110ae1;
      tVar37 = _utime_gap(tVar36,atStack_18260[0]);
    } while (((filemgr *)tVar37.tv_sec < pcVar33) &&
            (pfVar10 = (fdb_kvs_handle *)(ulong)(iVar5 + 1), iVar5 != 99999));
    pfStack_18280 = (fdb_kvs_handle *)0x110b01;
    fVar4 = fdb_close(pfStack_18270);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110b6a;
    pfStack_18280 = (fdb_kvs_handle *)0x110b0a;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_18280 = (fdb_kvs_handle *)0x110b13;
      memleak_end();
      pcVar23 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar23 = "%s FAILED\n";
      }
      pfStack_18280 = (fdb_kvs_handle *)0x110b44;
      fprintf(_stderr,pcVar23,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110b60:
    pfStack_18280 = (fdb_kvs_handle *)0x110b65;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b65:
    pfStack_18280 = (fdb_kvs_handle *)0x110b6a;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b6a:
    pfStack_18280 = (fdb_kvs_handle *)0x110b6f;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_18280 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_182a8 = (filemgr *)pcVar33;
  pfStack_182a0 = pfVar28;
  pfStack_18298 = (fdb_kvs_handle *)_Var29._M_i;
  pfStack_18290 = pfVar30;
  pfStack_18288 = pfVar14;
  pfStack_18280 = pfVar10;
  gettimeofday(&tStack_185b0,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_18620._32_8_ = (btree *)0x0;
  auStack_18620._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_183a0.wal_threshold = 0x1000;
  fStack_183a0.compaction_mode = '\x01';
  fStack_183a0.compaction_threshold = '\n';
  fStack_183a0.compactor_sleep_duration = 1;
  info_00 = (fdb_file_info *)0x14d0c5;
  pfVar10 = (fdb_kvs_handle *)&pfStack_18640;
  kvs_config_01 = (fdb_file_info *)0x1;
  fVar4 = fdb_open_custom_cmp((fdb_file_handle **)pfVar10,"compact_test",&fStack_183a0,1,
                              (char **)(auStack_18620 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_18620 + 0x18),(void **)0x0);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_18620._16_8_ = afStack_185a0[0].doc_count;
    auStack_18620._0_8_ = afStack_185a0[0].filename;
    auStack_18620._8_8_ = afStack_185a0[0].new_filename;
    info_00 = (fdb_file_info *)auStack_18638;
    pfVar10 = pfStack_18640;
    fVar4 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_18640,(fdb_kvs_handle **)info_00,
                       (fdb_kvs_config *)auStack_18620);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f6c;
    info_00 = (fdb_file_info *)auStack_18628;
    kvs_config_01 = (fdb_file_info *)auStack_18620;
    pfVar10 = pfStack_18640;
    fVar4 = fdb_kvs_open((fdb_file_handle *)pfStack_18640,(fdb_kvs_handle **)info_00,"db",
                         (fdb_kvs_config *)kvs_config_01);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f71;
    uVar16 = 0;
    do {
      sprintf((char *)afStack_185a0,"key%06d",uVar16);
      sprintf((char *)afStack_184a0,"body%06d",uVar16);
      pfVar10 = (fdb_kvs_handle *)auStack_18638._0_8_;
      sVar6 = strlen((char *)afStack_185a0);
      sVar7 = strlen((char *)afStack_184a0);
      kvs_config_01 = afStack_184a0;
      info_00 = afStack_185a0;
      fVar4 = fdb_set_kv(pfVar10,afStack_185a0,sVar6,afStack_184a0,sVar7);
      handle = auStack_18628;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00110f53:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110f58;
      }
      sVar6 = strlen((char *)afStack_185a0);
      sVar7 = strlen((char *)afStack_184a0);
      kvs_config_01 = afStack_184a0;
      info_00 = afStack_185a0;
      fVar4 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_185a0,sVar6,afStack_184a0,sVar7);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar10 = (fdb_kvs_handle *)handle;
        goto LAB_00110f53;
      }
      uVar21 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar21;
    } while (uVar21 != 10000);
    kvs_config_01 = (fdb_file_info *)auStack_18620;
    auStack_18620._8_8_ = _compact_test_keycmp;
    info_00 = (fdb_file_info *)(auStack_18638 + 8);
    pfVar10 = pfStack_18640;
    fVar4 = fdb_kvs_open((fdb_file_handle *)pfStack_18640,(fdb_kvs_handle **)info_00,"db_custom",
                         (fdb_kvs_config *)kvs_config_01);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f76;
    info_00 = afStack_185a0;
    sprintf((char *)info_00,"key%06d",0);
    kvs_config_01 = afStack_184a0;
    sprintf((char *)kvs_config_01,"body%06d",0);
    sVar6 = strlen((char *)info_00);
    sVar7 = strlen((char *)kvs_config_01);
    fVar4 = fdb_set_kv((fdb_kvs_handle *)auStack_18638._8_8_,info_00,sVar6,kvs_config_01,sVar7);
    pfVar10 = (fdb_kvs_handle *)auStack_18638._8_8_;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f7b;
    info_00 = (fdb_file_info *)0x0;
    pfVar10 = pfStack_18640;
    fVar4 = fdb_commit((fdb_file_handle *)pfStack_18640,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f80;
    uVar16 = 0;
    uVar31 = 0;
    do {
      sprintf((char *)afStack_185a0,"key%06d",uVar31);
      sprintf((char *)afStack_184a0,"body%06d",uVar31);
      pfVar10 = (fdb_kvs_handle *)auStack_18638._0_8_;
      sVar6 = strlen((char *)afStack_185a0);
      sVar7 = strlen((char *)afStack_184a0);
      kvs_config_01 = afStack_184a0;
      info_00 = afStack_185a0;
      fVar4 = fdb_set_kv(pfVar10,afStack_185a0,sVar6,afStack_184a0,sVar7);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      info_00 = (fdb_file_info *)(auStack_18620 + 0x28);
      pfVar10 = pfStack_18640;
      fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18640,info_00);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f58;
      if (uVar16 < uStack_185d0) {
        uVar16 = uStack_185d0;
      }
      uVar21 = (int)uVar31 + 1;
      uVar31 = (ulong)uVar21;
    } while (uVar21 != 10000);
    info_00 = (fdb_file_info *)0x0;
    pfVar10 = pfStack_18640;
    fVar4 = fdb_commit((fdb_file_handle *)pfStack_18640,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f85;
    info_00 = (fdb_file_info *)(auStack_18620 + 0x28);
    pfVar10 = pfStack_18640;
    fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18640,info_00);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f8a;
    if (uVar16 < uStack_185d0) {
      uVar16 = uStack_185d0;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar16);
    do {
      sleep(1);
      info_00 = (fdb_file_info *)(auStack_18620 + 0x28);
      pfVar10 = pfStack_18640;
      fVar4 = fdb_get_file_info((fdb_file_handle *)pfStack_18640,
                                (fdb_file_info *)(auStack_18620 + 0x28));
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00110f62;
    } while (uVar16 <= uStack_185d0);
    fVar4 = fdb_close((fdb_file_handle *)pfStack_18640);
    pfVar10 = pfStack_18640;
    if (fVar4 == FDB_RESULT_SUCCESS) {
      fVar4 = fdb_shutdown();
      pfVar10 = pfStack_18640;
      if (fVar4 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar23 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar23 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar23,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110f94;
    }
  }
  else {
LAB_00110f67:
    auto_compaction_with_custom_cmp_function();
LAB_00110f6c:
    auto_compaction_with_custom_cmp_function();
LAB_00110f71:
    auto_compaction_with_custom_cmp_function();
LAB_00110f76:
    auto_compaction_with_custom_cmp_function();
LAB_00110f7b:
    auto_compaction_with_custom_cmp_function();
LAB_00110f80:
    auto_compaction_with_custom_cmp_function();
LAB_00110f85:
    auto_compaction_with_custom_cmp_function();
LAB_00110f8a:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110f94:
  auto_compaction_with_custom_cmp_function();
  if (info_00 == kvs_config_01) {
    memcmp(pfVar10,__s2,(size_t)info_00);
    return;
  }
  if (info_00 < kvs_config_01) {
    kvs_config_01 = info_00;
  }
  memcmp(pfVar10,__s2,(size_t)kvs_config_01);
  return;
}

Assistant:

void compact_with_reopen_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 100;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256], temp[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove doc
    fdb_doc_create(&rdoc, doc[1]->key, doc[1]->keylen, doc[1]->meta, doc[1]->metalen, NULL, 0);
    rdoc->deleted = true;
    fdb_set(db, rdoc);
    fdb_doc_free(rdoc);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // perform compaction using one handle
    fdb_compact(dbfile, (char *) "./compact_test2");

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    r = system(SHELL_MOVE " compact_test2 compact_test1 > errorlog.txt");
    (void)r;
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // retrieve documents using the other handle without close/re-open
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 1) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        }else{
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
    }
    // check the other handle's filename
    fdb_file_info info;
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(!strcmp("./compact_test1", info.filename));

    // update documents
    for (i=0;i<n;++i){
        sprintf(metabuf, "newmeta%d", i);
        sprintf(bodybuf, "newbody%d_%s", i, temp);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
                       (void *)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // Open the database with another handle.
    fdb_file_handle *second_dbfile;
    fdb_kvs_handle *second_dbh;
    fdb_open(&second_dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(second_dbfile, &second_dbh, &kvs_config);
    status = fdb_set_log_callback(second_dbh, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // In-place compactions with a handle still open on the first old file
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // MB-12977: retest compaction again..
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_close(db);
    fdb_close(dbfile);

    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(second_dbh, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        // free result document
        fdb_doc_free(rdoc);
    }

    // Open database with an original name.
    status = fdb_open(&dbfile, "./compact_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_get_file_info(dbfile, &info);
    // The actual file name should be a compacted one.
    TEST_CHK(!strcmp("./compact_test1.3", info.filename));

    fdb_kvs_close(second_dbh);
    fdb_close(second_dbfile);

    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        // free result document
        fdb_doc_free(rdoc);
    }

    fdb_compact(dbfile, NULL);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    r = system(SHELL_MOVE " compact_test1 compact_test.fdb > errorlog.txt");
    (void)r;
    fdb_open(&dbfile, "./compact_test.fdb", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // In-place compaction
    fdb_compact(dbfile, NULL);
    fdb_kvs_close(db);
    fdb_close(dbfile);
    // Open database with an original name.
    status = fdb_open(&dbfile, "./compact_test.fdb", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(!strcmp("./compact_test.fdb", info.filename));
    TEST_CHK(info.doc_count == 100);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compaction with reopen test");
}